

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

_Bool av1_rd_pick_partition
                (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                int mi_row,int mi_col,BLOCK_SIZE bsize,RD_STATS *rd_cost,RD_STATS best_rdc,
                PC_TREE *pc_tree,SIMPLE_MOTION_DATA_TREE *sms_tree,int64_t *none_rd,
                SB_MULTI_PASS_MODE multi_pass_mode,RD_RECT_PART_WIN_INFO *rect_part_win_info)

{
  char *pcVar1;
  RD_RECT_PART_WIN_INFO *rect_part_win_info_00;
  int16_t *piVar2;
  int16_t (*paiVar3) [8];
  PARTITION_SEARCH_TYPE partition_search_type;
  undefined4 uVar4;
  FRAME_CONTEXT *pFVar5;
  long *plVar6;
  MB_MODE_INFO *pMVar7;
  aom_internal_error_info *info;
  undefined8 *puVar8;
  AV1_PRIMARY *pAVar9;
  int64_t iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  RD_STATS best_rdc_00;
  RD_STATS best_rdcost;
  RD_STATS best_rd;
  undefined1 auVar14 [14];
  int16_t aiVar15 [8];
  bool bVar16;
  undefined5 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  MACROBLOCK *pMVar20;
  uint8_t uVar21;
  _Bool _Var22;
  BLOCK_SIZE BVar23;
  undefined1 uVar24;
  undefined1 extraout_AL;
  int iVar25;
  int iVar26;
  int iVar27;
  PICK_MODE_CONTEXT *pPVar28;
  PC_TREE *pPVar29;
  int *piVar30;
  undefined7 uVar35;
  PICK_MODE_CONTEXT **ppPVar31;
  PC_TREE *pPVar32;
  int *piVar33;
  void *pvVar34;
  byte bVar36;
  uint8_t uVar37;
  byte bVar38;
  uint uVar39;
  long lVar40;
  SIMPLE_MOTION_DATA_TREE *sms_tree_00;
  uint *puVar41;
  char cVar42;
  char cVar43;
  AV1_COMP *pAVar44;
  int *piVar45;
  long lVar46;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *__n;
  int i;
  long lVar47;
  AV1_COMP *cpi_00;
  undefined1 *puVar48;
  undefined8 *puVar49;
  undefined1 *puVar50;
  undefined1 *puVar51;
  anon_struct_2_2_d7866a68 *paVar52;
  PARTITION_TYPE PVar53;
  int iVar54;
  uint uVar55;
  anon_struct_2_2_d7866a68 *__n_00;
  BLOCK_SIZE BVar56;
  BLOCK_SIZE BVar57;
  char cVar58;
  uint uVar59;
  ulong uVar60;
  int64_t iVar61;
  ThreadData_conflict *pTVar62;
  RD_SEARCH_MACROBLOCK_CONTEXT *ctx;
  BLOCK_SIZE (*dst_ctx) [6];
  int iVar63;
  undefined4 in_register_00000084;
  ulong uVar64;
  int iVar65;
  int iVar66;
  PartitionSearchState *part_state;
  uint uVar67;
  ThreadData_conflict *pTVar68;
  AB_PART_TYPE ab_part_type;
  BLOCK_SIZE BVar69;
  int64_t *none_rd_00;
  int iVar70;
  ulong uVar71;
  anon_struct_2_2_d7866a68 *part_split_rd;
  double *pdVar72;
  AV1_COMP *pAVar73;
  anon_struct_2_2_d7866a68 *paVar74;
  AV1_COMP *__s;
  bool bVar75;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined7 uVar79;
  ThreadData_conflict *pTVar80;
  undefined8 uStack_560;
  undefined4 uStack_54c;
  byte local_540;
  int part4_search_allowed [2];
  BLOCK_SIZE local_518;
  undefined7 uStack_517;
  undefined6 uStack_510;
  undefined1 uStack_50a;
  undefined1 uStack_509;
  ulong local_500;
  int64_t local_4f0;
  uint local_4d8;
  undefined1 local_4cc [12];
  PartitionSearchState part_search_state;
  undefined1 local_378 [16];
  long lStack_368;
  int64_t local_360;
  uint8_t local_358;
  int16_t aiStack_357 [3];
  ulong local_350;
  double var_max;
  undefined8 uStack_340;
  anon_struct_2_2_d7866a68 *local_338;
  int iStack_330;
  int iStack_32c;
  undefined1 local_328;
  int16_t aiStack_327 [3];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [8];
  undefined1 local_2e8 [16];
  PICK_MODE_CONTEXT *local_2d8;
  anon_struct_2_2_d7866a68 *local_2c8;
  PICK_MODE_CONTEXT **local_2c0;
  PICK_MODE_CONTEXT **local_2b8;
  PC_TREE_SHARED_BUFFERS *local_2b0;
  int local_2a4;
  SuperBlockEnc *local_2a0;
  ulong local_298;
  int64_t local_290;
  PICK_MODE_CONTEXT **local_288;
  PICK_MODE_CONTEXT **local_280;
  double var_max_1;
  PICK_MODE_CONTEXT **local_270 [7];
  int local_238;
  int local_234 [2];
  int16_t local_22c [2];
  int local_228;
  int16_t local_224 [2];
  int local_220;
  int16_t local_21c [2];
  undefined4 *local_218;
  PICK_MODE_CONTEXT **local_210;
  PICK_MODE_CONTEXT **local_208;
  PICK_MODE_CONTEXT **local_200;
  PICK_MODE_CONTEXT **local_1f8;
  buf_2d *local_1f0;
  MACROBLOCKD *local_1e8;
  PICK_MODE_CONTEXT **local_1e0;
  PICK_MODE_CONTEXT **local_1d8;
  long local_1d0;
  long local_1c8;
  ModeCosts *local_1c0;
  PICK_MODE_CONTEXT **cur_part_ctxs [4];
  int ab_partitions_allowed [4];
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  
  iVar61 = best_rdc.rdcost;
  local_500 = CONCAT44(in_register_00000084,mi_row);
  paVar52 = (anon_struct_2_2_d7866a68 *)&stack0xfffffffffffffa98;
  puVar51 = &stack0xfffffffffffffa98;
  puVar48 = &stack0xfffffffffffffa98;
  piVar33 = (int *)&stack0xfffffffffffffa98;
  pAVar73 = (AV1_COMP *)(ulong)bsize;
  bVar75 = ((cpi->common).seq_params)->monochrome == '\0';
  part_search_state.part_blk_params.mi_step =
       (int)(byte)((byte)pAVar73[7].frame_new_probs[8].tx_type_probs[2][0][0] >> 1);
  part_search_state.part_blk_params.mi_row_edge = part_search_state.part_blk_params.mi_step + mi_row
  ;
  part_search_state.part_blk_params.mi_col_edge = part_search_state.part_blk_params.mi_step + mi_col
  ;
  part_search_state.part_blk_params.width =
       (int)(byte)pAVar73[7].frame_new_probs[8].tx_type_probs[2][3][0];
  switch(pAVar73) {
  case (AV1_COMP *)0x0:
    bVar16 = false;
    pAVar44 = pAVar73;
    goto LAB_001eb3e7;
  case (AV1_COMP *)0x1:
  case (AV1_COMP *)0x2:
  case (AV1_COMP *)0x4:
  case (AV1_COMP *)0x5:
  case (AV1_COMP *)0x7:
  case (AV1_COMP *)0x8:
switchD_001eb3a5_caseD_1:
    bVar16 = true;
    pAVar44 = (AV1_COMP *)0x6;
    goto LAB_001eb3e7;
  case (AV1_COMP *)0x3:
    pAVar44 = (AV1_COMP *)0x1;
    break;
  case (AV1_COMP *)0x6:
    pAVar44 = (AV1_COMP *)0x2;
    break;
  case (AV1_COMP *)0x9:
    pAVar44 = (AV1_COMP *)0x3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      pAVar44 = (AV1_COMP *)&DAT_00000004;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001eb3a5_caseD_1;
      pAVar44 = (AV1_COMP *)0x5;
    }
  }
  bVar16 = false;
LAB_001eb3e7:
  part_search_state.part_blk_params.subsize = BLOCK_INVALID;
  if (!bVar16) {
    part_search_state.part_blk_params.subsize =
         *(BLOCK_SIZE *)((long)pAVar44[7].frame_new_probs[8].tx_type_probs[2][1] + 0x32);
  }
  part_search_state.part_blk_params.bsize_at_least_8x8._0_1_ = BLOCK_8X4 < bsize;
  part_search_state.part_blk_params.min_partition_size_1d =
       (uint)block_size_wide[(td->mb).sb_enc.min_partition_size];
  part_search_state.part_blk_params.bsize_at_least_8x8._1_3_ = 0;
  part_search_state.part_blk_params.bsize = bsize;
  iVar25 = (cpi->common).mi_params.mi_rows;
  uVar59 = (uint)(part_search_state.part_blk_params.mi_row_edge < iVar25);
  iVar27 = (cpi->common).mi_params.mi_cols;
  uVar67 = (uint)(part_search_state.part_blk_params.mi_col_edge < iVar27);
  part_search_state.intra_part_info = &(td->mb).part_search_info;
  if ((bsize == BLOCK_64X64) && (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
    (td->mb).part_search_info.quad_tree_idx = 0;
    (td->mb).part_search_info.cnn_output_valid = 0;
  }
  part_search_state.pl_ctx_idx = 0;
  if (BLOCK_8X4 < bsize) {
    bVar38 = (byte)pAVar73[7].frame_new_probs[8].tx_type_probs[2][1][0];
    uVar39 = bVar38 - 1;
    part_search_state.pl_ctx_idx =
         (uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_col] >> (uVar39 & 0x1f) & 1)
               != 0) +
         ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row & 0x1f] >> ((byte)uVar39 & 0x1f) &
         1) * 2 + (uint)bVar38 * 4 + -4;
  }
  local_1e8 = &(td->mb).e_mbd;
  local_2a0 = &(td->mb).sb_enc;
  iVar65 = bVar75 + 1 + (uint)bVar75;
  local_1c0 = &(td->mb).mode_costs;
  part_search_state.partition_cost =
       (td->mb).mode_costs.partition_cost[part_search_state.pl_ctx_idx];
  lVar40 = 0x34;
  do {
    *(undefined8 *)((long)part_search_state.split_part_rect_win[0].rect_part_win + lVar40 + -0x34) =
         0x100000001;
    *(undefined8 *)((long)part_search_state.split_part_rect_win[0].rect_part_win + lVar40 + -0x2c) =
         0x100000001;
    lVar40 = lVar40 + 0x10;
  } while (lVar40 != 0x54);
  part_search_state.partition_rect_allowed[1] = 0;
  part_search_state.this_rdc.rate = 0;
  part_search_state.this_rdc.zero_rate = 0;
  part_search_state.this_rdc.dist = 0;
  part_search_state.this_rdc.rdcost = 0;
  part_search_state.this_rdc.sse = 0;
  part_search_state.this_rdc.skip_txfm = '\x01';
  part_search_state.none_rd = 0;
  part_search_state.split_rd[0] = 0;
  part_search_state.split_rd[1] = 0;
  part_search_state.split_rd[2] = 0;
  part_search_state.split_rd[3] = 0;
  part_search_state.rect_part_rd[0][0] = 0;
  part_search_state.rect_part_rd[0][1] = 0;
  part_search_state.rect_part_rd[1][0] = 0;
  part_search_state.rect_part_rd[1][1] = 0;
  part_search_state.is_split_ctx_is_ready[0] = 0;
  part_search_state.is_split_ctx_is_ready[1] = 0;
  part_search_state.is_rect_ctx_is_ready[0] = 0;
  part_search_state.is_rect_ctx_is_ready[1] = 0;
  part_search_state.ss_x = (td->mb).e_mbd.plane[1].subsampling_x;
  part_search_state.ss_y = (td->mb).e_mbd.plane[1].subsampling_y;
  part_search_state.do_rectangular_split =
       (uint)part_search_state.part_blk_params.bsize_at_least_8x8._0_1_;
  if ((cpi->oxcf).part_cfg.enable_rect_partitions == false) {
    part_search_state.do_rectangular_split = 0;
  }
  part_search_state.do_square_split._0_1_ =
       part_search_state.part_blk_params.bsize_at_least_8x8._0_1_;
  part_search_state.do_square_split._1_3_ = 0;
  part_search_state.prune_rect_part[0] = 0;
  part_search_state.prune_rect_part[1] = 0;
  uVar39 = uVar67;
  if (iVar25 <= part_search_state.part_blk_params.mi_row_edge) {
    uVar39 = 0;
  }
  part_search_state._280_8_ = (ulong)uVar39 << 0x20;
  pTVar68 = (ThreadData_conflict *)0x0;
  if ((part_search_state.do_rectangular_split == 0) ||
     (iVar27 <= part_search_state.part_blk_params.mi_col_edge)) goto LAB_001eb6eb;
  switch(pAVar73) {
  case (AV1_COMP *)0x0:
    bVar75 = false;
    pAVar44 = pAVar73;
    goto LAB_001eb6b4;
  case (AV1_COMP *)0x1:
  case (AV1_COMP *)0x2:
  case (AV1_COMP *)0x4:
  case (AV1_COMP *)0x5:
  case (AV1_COMP *)0x7:
  case (AV1_COMP *)0x8:
switchD_001eb668_caseD_1:
    bVar75 = true;
    pAVar44 = (AV1_COMP *)0x6;
    goto LAB_001eb6b4;
  case (AV1_COMP *)0x3:
    pAVar44 = (AV1_COMP *)0x1;
    break;
  case (AV1_COMP *)0x6:
    pAVar44 = (AV1_COMP *)0x2;
    break;
  case (AV1_COMP *)0x9:
    pAVar44 = (AV1_COMP *)0x3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      pAVar44 = (AV1_COMP *)&DAT_00000004;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001eb668_caseD_1;
      pAVar44 = (AV1_COMP *)0x5;
    }
  }
  bVar75 = false;
LAB_001eb6b4:
  uVar71 = 0xff;
  if (!bVar75) {
    uVar71 = (ulong)*(byte *)((long)pAVar44[7].frame_new_probs[8].tx_type_probs[2][1] + 0x26);
  }
  pTVar68 = (ThreadData_conflict *)
            (ulong)(av1_ss_size_lookup[uVar71][part_search_state.ss_x][part_search_state.ss_y] !=
                   BLOCK_INVALID);
LAB_001eb6eb:
  part_search_state.partition_rect_allowed[0] = (int)pTVar68;
  if ((part_search_state.do_rectangular_split == 0) ||
     (part_search_state.partition_rect_allowed[1] = 0,
     iVar25 <= part_search_state.part_blk_params.mi_row_edge)) goto LAB_001eb7a8;
  switch(pAVar73) {
  case (AV1_COMP *)0x0:
    bVar75 = false;
    pAVar44 = pAVar73;
    goto LAB_001eb771;
  case (AV1_COMP *)0x1:
  case (AV1_COMP *)0x2:
  case (AV1_COMP *)0x4:
  case (AV1_COMP *)0x5:
  case (AV1_COMP *)0x7:
  case (AV1_COMP *)0x8:
switchD_001eb721_caseD_1:
    bVar75 = true;
    pAVar44 = (AV1_COMP *)0x6;
    goto LAB_001eb771;
  case (AV1_COMP *)0x3:
    pAVar44 = (AV1_COMP *)0x1;
    break;
  case (AV1_COMP *)0x6:
    pAVar44 = (AV1_COMP *)0x2;
    break;
  case (AV1_COMP *)0x9:
    pAVar44 = (AV1_COMP *)0x3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      pAVar44 = (AV1_COMP *)&DAT_00000004;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001eb721_caseD_1;
      pAVar44 = (AV1_COMP *)0x5;
    }
  }
  bVar75 = false;
LAB_001eb771:
  uVar71 = 0xff;
  if (!bVar75) {
    uVar71 = (ulong)(byte)pAVar44[7].frame_new_probs[8].tx_type_probs[2][1][0xb];
  }
  pTVar68 = (ThreadData_conflict *)(av1_ss_size_lookup + uVar71);
  part_search_state.partition_rect_allowed[1] =
       (int)(*(BLOCK_SIZE *)
              ((long)&(pTVar68->mb).plane[0].src_diff +
              (long)part_search_state.ss_y + (long)part_search_state.ss_x * 2) != BLOCK_INVALID);
LAB_001eb7a8:
  part_search_state.found_best_partition = false;
  if (sms_tree != (SIMPLE_MOTION_DATA_TREE *)0x0) {
    sms_tree->partitioning = '\0';
  }
  if (best_rdc.rdcost < 0) {
    rd_cost->rate = 0x7fffffff;
    rd_cost->zero_rate = 0;
    rd_cost->dist = 0x7fffffffffffffff;
    rd_cost->rdcost = 0x7fffffffffffffff;
    rd_cost->sse = 0x7fffffffffffffff;
    rd_cost->skip_txfm = '\0';
    return (_Bool)0;
  }
  if (((cpi->common).seq_params)->sb_size == bsize) {
    (td->mb).must_find_valid_partition = 0;
  }
  local_298 = (ulong)bsize;
  if (none_rd != (int64_t *)0x0) {
    *none_rd = 0;
  }
  part_search_state.part_blk_params.mi_row = mi_row;
  part_search_state.part_blk_params.mi_col = mi_col;
  part_search_state.part_blk_params.has_rows = uVar59;
  part_search_state.part_blk_params.has_cols = uVar67;
  part_search_state.part_blk_params.split_bsize2 = part_search_state.part_blk_params.subsize;
  if (uVar59 == 0 || uVar67 == 0) {
    piVar30 = part_search_state.tmp_partition_cost;
    part_search_state.tmp_partition_cost[0] = 0x1e00;
    pFVar5 = (cpi->common).fc;
    part_search_state.tmp_partition_cost[1] = part_search_state.tmp_partition_cost[0];
    part_search_state.tmp_partition_cost[2] = part_search_state.tmp_partition_cost[0];
    if (part_search_state.part_blk_params.mi_col_edge < iVar27) {
      x_ctx.a._0_2_ =
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][7] -
           pFVar5->partition_cdf[part_search_state.pl_ctx_idx][6]) +
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][6] -
           pFVar5->partition_cdf[part_search_state.pl_ctx_idx][5]) +
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][4] -
           pFVar5->partition_cdf[part_search_state.pl_ctx_idx][3]) +
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][3] -
           pFVar5->partition_cdf[part_search_state.pl_ctx_idx][2]) +
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][2] -
            pFVar5->partition_cdf[part_search_state.pl_ctx_idx][1] ^ 0x8000);
      if (bsize != BLOCK_128X128) {
        x_ctx.a._0_2_ =
             (x_ctx.a._0_2_ - pFVar5->partition_cdf[part_search_state.pl_ctx_idx][8]) +
             pFVar5->partition_cdf[part_search_state.pl_ctx_idx][9];
      }
      piVar45 = (int *)&set_partition_cost_for_edge_blk_bot_inv_map;
    }
    else {
      if (iVar25 <= part_search_state.part_blk_params.mi_row_edge) {
        part_search_state.tmp_partition_cost[3] = 0;
        part_search_state.partition_cost = piVar30;
        goto LAB_001eba39;
      }
      x_ctx.a._0_2_ =
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][6] -
           pFVar5->partition_cdf[part_search_state.pl_ctx_idx][5]) +
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][5] -
           pFVar5->partition_cdf[part_search_state.pl_ctx_idx][4]) +
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][4] -
           pFVar5->partition_cdf[part_search_state.pl_ctx_idx][3]) +
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][3] -
           pFVar5->partition_cdf[part_search_state.pl_ctx_idx][2]) +
           (pFVar5->partition_cdf[part_search_state.pl_ctx_idx][1] -
            pFVar5->partition_cdf[part_search_state.pl_ctx_idx][0] ^ 0x8000);
      if (bsize != BLOCK_128X128) {
        x_ctx.a._0_2_ =
             (x_ctx.a._0_2_ - pFVar5->partition_cdf[part_search_state.pl_ctx_idx][7]) +
             pFVar5->partition_cdf[part_search_state.pl_ctx_idx][8];
      }
      piVar45 = (int *)&set_partition_cost_for_edge_blk_rhs_inv_map;
    }
    x_ctx.a._0_2_ = -0x8000 - x_ctx.a._0_2_;
    x_ctx.a[2] = '\0';
    x_ctx.a[3] = '\0';
    part_search_state.tmp_partition_cost[3] = part_search_state.tmp_partition_cost[0];
    av1_cost_tokens_from_cdf(piVar30,(aom_cdf_prob *)&x_ctx,piVar45);
    part_search_state.partition_cost = piVar30;
  }
LAB_001eba39:
  if ((cpi->sf).part_sf.use_square_partition_only_threshold < bsize) {
    uVar39 = part_search_state.partition_rect_allowed[0] & 1;
    part_search_state.partition_rect_allowed[0] = 0;
    if (uVar59 == 0) {
      part_search_state.partition_rect_allowed[0] = uVar39;
    }
    part_search_state.partition_rect_allowed[1] =
         part_search_state.partition_rect_allowed[1] & (uint)(uVar67 == 0);
  }
  av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  if (((cpi->oxcf).mode == '\x02') && (((cpi->common).seq_params)->sb_size == bsize)) {
    log_sub_block_var(cpi,&td->mb,bsize,(double *)&x_ctx,&var_max);
    (td->mb).intra_sb_rdmult_modifier = 0x80;
    dVar76 = (double)CONCAT44(x_ctx.a._4_4_,CONCAT22(x_ctx.a._2_2_,x_ctx.a._0_2_));
    if ((dVar76 < 2.0) && (4.0 < var_max)) {
      dVar76 = var_max - dVar76;
      iVar25 = 0x50;
      if (dVar76 <= 8.0) {
        iVar25 = 0x80 - (int)(dVar76 * 6.0);
      }
      (td->mb).intra_sb_rdmult_modifier = iVar25;
    }
  }
  local_2a4 = (td->mb).rdmult;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  if (((ulong)(uint)best_rdc.rate == 0x7fffffff) ||
     (iVar61 == 0x7fffffffffffffff || best_rdc.dist == 0x7fffffffffffffff)) {
    best_rdc.rate = 0x7fffffff;
    best_rdc.zero_rate = 0;
    best_rdc.dist = 0x7fffffffffffffff;
    best_rdc.rdcost = 0x7fffffffffffffff;
    best_rdc.sse = 0x7fffffffffffffff;
    best_rdc.skip_txfm = '\0';
  }
  else {
    lVar40 = (long)(td->mb).rdmult;
    if (best_rdc.rate < 0) {
      best_rdc.rdcost =
           best_rdc.dist * 0x80 - ((long)((ulong)(uint)-best_rdc.rate * lVar40 + 0x100) >> 9);
    }
    else {
      best_rdc.rdcost =
           best_rdc.dist * 0x80 + ((long)((ulong)(uint)best_rdc.rate * lVar40 + 0x100) >> 9);
    }
  }
  part_split_rd = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
  if ((bsize == BLOCK_16X16) && (cpi->vaq_refresh != 0)) {
    iVar25 = av1_log_block_var(cpi,&td->mb,BLOCK_16X16);
    (td->mb).mb_energy = iVar25;
  }
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + mi_col;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  av1_save_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar65);
  av1_prune_partitions_before_search(cpi,&td->mb,sms_tree,&part_search_state);
  uVar24 = 0xc4;
  uVar79 = 0x1ebc;
  av1_prune_partitions_by_max_min_bsize(local_2a0,&part_search_state);
  local_2b0 = &td->shared_coeff_buf;
  pAVar44 = (AV1_COMP *)&best_rdc;
  local_218 = (undefined4 *)&best_rdc.field_0x21;
  local_2b8 = pc_tree->horizontal;
  local_280 = pc_tree->horizontal + 1;
  local_2c0 = pc_tree->vertical;
  local_288 = pc_tree->vertical + 1;
  local_1f0 = &(td->mb).plane[0].src;
  local_1f8 = pc_tree->horizontala;
  local_200 = pc_tree->horizontalb;
  local_208 = pc_tree->verticala;
  local_210 = pc_tree->verticalb;
  local_1d8 = pc_tree->horizontal4;
  local_1e0 = pc_tree->vertical4;
  cpi_00 = cpi;
  pPVar32 = pc_tree;
  __s = pAVar73;
  pTVar80 = td;
LAB_001ebd7f:
  bVar38 = (byte)__s;
  if ((td->mb).must_find_valid_partition == 0) goto LAB_001ebfa5;
  part_search_state.partition_rect_allowed[0] = 0;
  if (part_search_state.part_blk_params.bsize_at_least_8x8 == 0) {
    bVar36 = 0;
  }
  else {
    bVar36 = part_search_state.part_blk_params.min_partition_size_1d <
             part_search_state.part_blk_params.width &
             (cpi_00->oxcf).part_cfg.enable_rect_partitions;
  }
  uVar71 = (ulong)part_search_state.part_blk_params.bsize;
  bVar75 = (part_search_state.part_blk_params.has_cols != 0 &&
           part_search_state.part_blk_params.has_rows != 0) &&
           part_search_state.part_blk_params.min_partition_size_1d <=
           part_search_state.part_blk_params.width;
  pTVar68 = (ThreadData_conflict *)CONCAT71((int7)((ulong)pTVar68 >> 8),bVar75);
  part_search_state.do_square_split._0_1_ =
       part_search_state.part_blk_params.min_partition_size_1d <
       part_search_state.part_blk_params.width &&
       part_search_state.part_blk_params.bsize_at_least_8x8 != 0;
  part_search_state.do_square_split._1_3_ = 0;
  if ((part_search_state.part_blk_params.has_cols == 0) || (bVar36 == 0)) goto LAB_001ebeb8;
  switch(uVar71) {
  case 0:
    bVar16 = false;
    uVar60 = uVar71;
    goto LAB_001ebe76;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001ebe36_caseD_1:
    bVar16 = true;
    uVar60 = 6;
    goto LAB_001ebe76;
  case 3:
    uVar60 = 1;
    break;
  case 6:
    uVar60 = 2;
    break;
  case 9:
    uVar60 = 3;
    break;
  default:
    if (part_search_state.part_blk_params.bsize == BLOCK_64X64) {
      uVar60 = 4;
    }
    else {
      if (part_search_state.part_blk_params.bsize != BLOCK_128X128) goto switchD_001ebe36_caseD_1;
      uVar60 = 5;
    }
  }
  bVar16 = false;
LAB_001ebe76:
  uVar64 = 0xff;
  if (!bVar16) {
    uVar64 = (ulong)subsize_lookup[1][uVar60];
  }
  part_search_state.partition_rect_allowed[0] =
       (int)(av1_ss_size_lookup[uVar64][part_search_state.ss_x][part_search_state.ss_y] !=
            BLOCK_INVALID);
LAB_001ebeb8:
  part_search_state.partition_rect_allowed[1] = 0;
  if ((part_search_state.part_blk_params.has_rows != 0 & bVar36) == 1) {
    switch(uVar71) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
switchD_001ebee6_caseD_1:
      uVar71 = 6;
      bVar16 = true;
      goto LAB_001ebf1e;
    case 3:
      uVar71 = 1;
      break;
    case 6:
      uVar71 = 2;
      break;
    case 9:
      uVar71 = 3;
      break;
    default:
      if (part_search_state.part_blk_params.bsize == BLOCK_64X64) {
        uVar71 = 4;
      }
      else {
        if (part_search_state.part_blk_params.bsize != BLOCK_128X128) goto switchD_001ebee6_caseD_1;
        uVar71 = 5;
      }
    }
    bVar16 = false;
LAB_001ebf1e:
    uVar60 = 0xff;
    if (!bVar16) {
      uVar60 = (ulong)subsize_lookup[2][uVar71];
    }
    part_search_state.partition_rect_allowed[1] =
         (int)(av1_ss_size_lookup[uVar60][part_search_state.ss_x][part_search_state.ss_y] !=
              BLOCK_INVALID);
  }
  part_search_state._280_8_ = (ulong)bVar75 << 0x20;
  uVar24 = 0x82;
  uVar79 = 0x1ebf;
  td = pTVar80;
  av1_prune_partitions_by_max_min_bsize(local_2a0,&part_search_state);
  pTVar80 = td;
  if ((bVar38 == 0xc) && (((cpi_00->common).current_frame.frame_type & 0xfd) == 0)) {
    (part_search_state.intra_part_info)->quad_tree_idx = 0;
    (part_search_state.intra_part_info)->cnn_output_valid = 0;
  }
LAB_001ebfa5:
  if ((cpi_00->oxcf).mode == '\x02') {
    if ((cpi->sf).part_sf.prune_rect_part_using_4x4_var_deviation == true) {
      bVar75 = (td->mb).must_find_valid_partition == 0;
    }
    else {
      bVar75 = false;
    }
    if (5 < bVar38 || bVar75) {
      uVar24 = 2;
      uVar79 = 0x1ec0;
      log_sub_block_var(cpi,&td->mb,bsize,&var_max,&var_max_1);
      td = pTVar80;
      pTVar80 = td;
      if (((bVar38 < 6) || (0.272 <= var_max)) || (var_max_1 - var_max <= 3.0)) {
        if ((bVar75) && (var_max_1 - var_max < 3.0)) {
          part_search_state._296_8_ = part_search_state._296_8_ & 0xffffffff00000000;
        }
      }
      else {
        part_search_state.terminate_partition_search = 0;
        part_search_state.partition_none_allowed = 0;
        part_search_state.do_square_split = 1;
      }
    }
  }
  BVar23 = part_search_state.part_blk_params.bsize;
  iVar27 = part_search_state.part_blk_params.mi_col;
  iVar25 = part_search_state.part_blk_params.mi_row;
  local_4d8 = 0xffffffff;
  paVar74 = part_split_rd;
  if ((part_search_state.terminate_partition_search == 0) &&
     (part_search_state.partition_none_allowed != 0)) {
    iVar26 = part_search_state.part_blk_params.bsize_at_least_8x8;
    uStack_340 = (ulong)part_split_rd;
    var_max = 1.06099789498857e-314;
    local_338 = part_split_rd;
    iStack_330 = (int)part_split_rd;
    iStack_32c = (int)((ulong)part_split_rd >> 0x20);
    local_328 = 0;
    if (pPVar32->none == (PICK_MODE_CONTEXT *)0x0) {
      td = pTVar80;
      pPVar28 = av1_alloc_pmc(cpi,part_search_state.part_blk_params.bsize,local_2b0);
      pPVar32->none = pPVar28;
      pTVar80 = td;
    }
    if (pPVar32->none == (PICK_MODE_CONTEXT *)0x0) {
      pMVar20 = &td->mb;
      td = pTVar80;
      aom_internal_error((pMVar20->e_mbd).error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
      pTVar80 = td;
    }
    if (part_search_state.partition_none_allowed == 0) {
      iVar70 = 0;
    }
    else {
      if (iVar26 == 0) {
        iVar70 = 0;
      }
      else {
        iVar70 = *part_search_state.partition_cost;
        if (*part_search_state.partition_cost == 0x7fffffff) {
          iVar70 = 0;
        }
      }
      if (((*(int *)&pAVar44->ppi == 0x7fffffff) ||
          (lVar40 = *(long *)&pAVar44->field_0x8, lVar40 == 0x7fffffffffffffff)) ||
         (*(long *)(pAVar44->enc_quant_dequant_params).quants.y_quant[0] == 0x7fffffffffffffff)) {
        uStack_340 = 0x7fffffffffffffff;
        var_max = 1.06099789498857e-314;
        local_338 = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
        iStack_330 = -1;
        iStack_32c = 0x7fffffff;
        local_328 = 0;
      }
      else {
        lVar47 = (long)(td->mb).rdmult;
        uVar59 = *(int *)&pAVar44->ppi - iVar70;
        var_max._0_4_ = uVar59;
        uStack_340 = lVar40;
        if ((int)uVar59 < 0) {
          local_338 = (anon_struct_2_2_d7866a68 *)
                      (lVar40 * 0x80 - ((long)((ulong)-uVar59 * lVar47 + 0x100) >> 9));
        }
        else {
          local_338 = (anon_struct_2_2_d7866a68 *)
                      (lVar40 * 0x80 + ((long)((ulong)uVar59 * lVar47 + 0x100) >> 9));
        }
      }
    }
    best_rd.rdcost._0_1_ = (char)local_338;
    best_rd.rate = var_max._0_4_;
    best_rd.zero_rate = var_max._4_4_;
    best_rd.dist = uStack_340;
    best_rd.rdcost._1_7_ = (int7)((ulong)local_338 >> 8);
    best_rd.sse._0_4_ = iStack_330;
    best_rd.sse._4_4_ = iStack_32c;
    best_rd.skip_txfm = local_328;
    best_rd._33_7_ = _aiStack_327;
    pick_sb_modes(cpi,tile_data,&td->mb,iVar25,iVar27,&part_search_state.this_rdc,'\0',BVar23,
                  pPVar32->none,best_rd);
    if ((((part_search_state.this_rdc._0_8_ & 0xffffffff) == 0x7fffffff) ||
        (part_search_state.this_rdc.dist == 0x7fffffffffffffff)) ||
       (part_search_state.this_rdc.rdcost == 0x7fffffffffffffff)) {
      part_search_state.this_rdc.rate = 0x7fffffff;
      part_search_state.this_rdc.zero_rate = 0;
      part_search_state.this_rdc.dist = 0x7fffffffffffffff;
      part_search_state.this_rdc.rdcost = 0x7fffffffffffffff;
      part_search_state.this_rdc.sse = 0x7fffffffffffffff;
      part_search_state.this_rdc.skip_txfm = '\0';
    }
    else {
      lVar40 = (long)(pTVar80->mb).rdmult;
      if (part_search_state.this_rdc.rate < 0) {
        part_search_state.this_rdc.rdcost =
             part_search_state.this_rdc.dist * 0x80 -
             ((long)((ulong)(uint)-part_search_state.this_rdc.rate * lVar40 + 0x100) >> 9);
      }
      else {
        part_search_state.this_rdc.rdcost =
             part_search_state.this_rdc.dist * 0x80 +
             ((long)((part_search_state.this_rdc._0_8_ & 0xffffffff) * lVar40 + 0x100) >> 9);
      }
    }
    local_4d8 = (pTVar80->mb).source_variance;
    if (none_rd != (int64_t *)0x0) {
      *none_rd = part_search_state.this_rdc.rdcost;
    }
    part_search_state.none_rd = part_search_state.this_rdc.rdcost;
    paVar74 = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
    td = pTVar80;
    if (part_search_state.this_rdc.rate != 0x7fffffff) {
      pTVar68 = (ThreadData_conflict *)&comp_ref0_lut;
      if ((cpi->sf).inter_sf.prune_ref_frame_for_rect_partitions != 0) {
        cVar43 = (pPVar32->none->mic).ref_frame[0];
        cVar58 = (pPVar32->none->mic).ref_frame[1];
        if ('\0' < cVar58) {
          cVar42 = -1;
          if (cVar58 < '\x05' || '\x04' < cVar43) {
            lVar40 = 0;
            do {
              if ((cVar43 == (&comp_ref0_lut)[lVar40]) && (cVar58 == (&comp_ref1_lut)[lVar40])) {
                cVar42 = (char)lVar40;
                break;
              }
              lVar40 = lVar40 + 1;
            } while (lVar40 != 9);
          }
          if (cVar42 < '\0') {
            cVar43 = cVar58 * '\x04' + cVar43 + -0xd;
          }
          else {
            cVar43 = cVar42 + '\x14';
          }
        }
        av1_update_picked_ref_frames_mask
                  (&pTVar80->mb,(int)cVar43,BVar23,((cpi->common).seq_params)->mib_size,iVar25,
                   iVar27);
        td = pTVar80;
      }
      BVar69 = part_search_state.part_blk_params.bsize;
      iVar66 = part_search_state.part_blk_params.has_cols;
      iVar63 = part_search_state.part_blk_params.has_rows;
      if (iVar26 != 0) {
        lVar40 = (long)part_search_state.this_rdc.rate;
        part_search_state.this_rdc.rate = (int)(iVar70 + lVar40);
        part_search_state.this_rdc.rdcost =
             part_search_state.this_rdc.dist * 0x80 +
             ((long)(td->mb).rdmult * (iVar70 + lVar40) + 0x100 >> 9);
      }
      paVar74 = (anon_struct_2_2_d7866a68 *)part_search_state.this_rdc.rdcost;
      if (part_search_state.this_rdc.rdcost <
          *(long *)(pAVar44->enc_quant_dequant_params).quants.y_quant[0]) {
        *(ulong *)(pAVar44->enc_quant_dequant_params).quants.y_quant[1] =
             CONCAT71(part_search_state.this_rdc._33_7_,part_search_state.this_rdc.skip_txfm);
        aiVar15[4] = (undefined2)part_search_state.this_rdc.sse;
        aiVar15[5] = part_search_state.this_rdc.sse._2_2_;
        aiVar15[6] = part_search_state.this_rdc.sse._4_2_;
        aiVar15[7] = part_search_state.this_rdc.sse._6_2_;
        aiVar15[0] = (undefined2)part_search_state.this_rdc.rdcost;
        aiVar15[1] = part_search_state.this_rdc.rdcost._2_2_;
        aiVar15[2] = part_search_state.this_rdc.rdcost._4_2_;
        aiVar15[3] = part_search_state.this_rdc.rdcost._6_2_;
        (pAVar44->enc_quant_dequant_params).quants.y_quant[0] = aiVar15;
        pAVar44->ppi = (AV1_PRIMARY *)part_search_state.this_rdc._0_8_;
        *(int64_t *)&pAVar44->field_0x8 = part_search_state.this_rdc.dist;
        part_search_state.found_best_partition = true;
        if (iVar26 != 0) {
          pPVar32->partitioning = '\0';
        }
        uVar71 = (ulong)part_search_state.part_blk_params.bsize;
        if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
          if (((part_search_state.do_rectangular_split != 0 ||
                part_search_state.do_square_split != 0) &&
              ((td->mb).e_mbd.lossless[*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7] == 0)) &&
             (pPVar32->none->skippable != 0)) {
            if (((byte)(part_search_state.part_blk_params.bsize - BLOCK_4X8) <
                 (cpi->sf).part_sf.use_square_partition_only_threshold) &&
               (0 < (cpi->sf).part_sf.ml_predict_breakout_level)) {
              av1_ml_predict_breakout
                        (cpi,&td->mb,&part_search_state.this_rdc,local_4d8,(td->mb).e_mbd.bd,
                         &part_search_state);
            }
            if ((*(long *)&pAVar44->field_0x8 <
                 (cpi->sf).part_sf.partition_search_breakout_dist_thr >>
                 (10 - (""[uVar71] + ""[uVar71]) & 0x3f)) &&
               (*(int *)&pAVar44->ppi <
                (int)((uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar71] *
                     (cpi->sf).part_sf.partition_search_breakout_rate_thr))) {
              part_search_state.do_rectangular_split = 0;
              part_search_state.do_square_split = 0;
            }
          }
        }
        if (((((((cpi->sf).part_sf.simple_motion_search_early_term_none != 0) &&
               ((cpi->common).show_frame != 0)) &&
              (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
             ((BLOCK_16X8 < BVar69 && (iVar63 != 0)))) && (iVar66 != 0)) &&
           (((ulong)part_search_state.this_rdc.rdcost < 0x7fffffffffffffff &&
            ((uint)part_search_state.this_rdc.rate < 0x7fffffff)))) {
          if (part_search_state.do_rectangular_split != 0 || part_search_state.do_square_split != 0)
          {
            av1_simple_motion_search_early_term_none
                      (cpi,&td->mb,sms_tree,&part_search_state.this_rdc,&part_search_state);
          }
        }
      }
      if ((cpi->sf).part_sf.prune_rect_part_using_none_pred_mode == true) {
        bVar38 = (pPVar32->none->mic).mode;
        if (bVar38 < 10) {
          if ((0xc4U >> (bVar38 & 0x1f) & 1) == 0) {
            if ((0x122U >> (bVar38 & 0x1f) & 1) == 0) {
              if (((0x201U >> (bVar38 & 0x1f) & 1) != 0) &&
                 ((((td->mb).e_mbd.left_available == true &&
                   (BVar69 = ((td->mb).e_mbd.left_mbmi)->bsize,
                   (uint)block_size_wide[BVar23] * (uint)block_size_high[BVar23] <
                   (uint)block_size_wide[BVar69] * (uint)block_size_high[BVar69])) ||
                  (((td->mb).e_mbd.up_available == true &&
                   (BVar69 = ((td->mb).e_mbd.above_mbmi)->bsize,
                   (uint)block_size_wide[BVar23] * (uint)block_size_high[BVar23] <
                   (uint)block_size_wide[BVar69] * (uint)block_size_high[BVar69])))))) {
                part_search_state.prune_rect_part[0] = 1;
                part_search_state.prune_rect_part[1] = 1;
              }
            }
            else {
              part_search_state.prune_rect_part[0] = 1;
            }
          }
          else {
            part_search_state.prune_rect_part[1] = 1;
          }
        }
      }
    }
    bVar75 = ((cpi->common).seq_params)->monochrome == '\0';
    uVar24 = 0xe5;
    uVar79 = 0x1ec6;
    av1_restore_context(&td->mb,&x_ctx,iVar25,iVar27,BVar23,bVar75 + 1 + (uint)bVar75);
    part_split_rd = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
    pTVar80 = td;
  }
  BVar23 = part_search_state.part_blk_params.bsize;
  iVar26 = part_search_state.part_blk_params.mi_col;
  iVar27 = part_search_state.part_blk_params.mi_row;
  iVar25 = part_search_state.part_blk_params.mi_step;
  uVar71 = (ulong)part_search_state.part_blk_params.bsize;
  uVar17 = CONCAT14(var_max_1._7_1_,part_search_state.sum_rdc._36_4_);
  var_max_1 = (double)CONCAT44((int)((uint5)uVar17 >> 8),
                               CONCAT13(part_search_state.sum_rdc._36_1_,
                                        part_search_state.sum_rdc._33_3_));
  local_2c8 = paVar74;
  switch(uVar71) {
  case 0:
    bVar75 = false;
    goto LAB_001ec795;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001ec754_caseD_1:
    uVar71 = 6;
    bVar75 = true;
    goto LAB_001ec795;
  case 3:
    uVar71 = 1;
    break;
  case 6:
    uVar71 = 2;
    break;
  case 9:
    uVar71 = 3;
    break;
  default:
    if (part_search_state.part_blk_params.bsize == BLOCK_64X64) {
      uVar71 = 4;
    }
    else {
      if (part_search_state.part_blk_params.bsize != BLOCK_128X128) goto switchD_001ec754_caseD_1;
      uVar71 = 5;
    }
  }
  bVar75 = false;
LAB_001ec795:
  local_518 = BLOCK_INVALID;
  if (!bVar75) {
    local_518 = subsize_lookup[3][uVar71];
  }
  paVar74 = part_split_rd;
  if ((part_search_state.terminate_partition_search == 0) &&
     (part_search_state.do_square_split != 0)) {
    lVar40 = 0;
    do {
      if (pPVar32->split[lVar40] == (PC_TREE *)0x0) {
        uVar24 = 0xf2;
        uVar79 = 0x1ec7;
        td = pTVar80;
        pPVar29 = av1_alloc_pc_tree_node(local_518);
        pPVar32->split[lVar40] = pPVar29;
        pTVar80 = td;
      }
      if (pPVar32->split[lVar40] == (PC_TREE *)0x0) {
        pMVar20 = &td->mb;
        uVar24 = 0x1f;
        uVar79 = 0x1ec8;
        td = pTVar80;
        aom_internal_error((pMVar20->e_mbd).error_info,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
        pTVar80 = td;
      }
      pPVar32->split[lVar40]->index = (int)lVar40;
      lVar40 = lVar40 + 1;
    } while (lVar40 != 4);
    uVar60 = (ulong)part_search_state.partition_cost[3];
    part_split_rd =
         (anon_struct_2_2_d7866a68 *)((long)((long)(td->mb).rdmult * uVar60 + 0x100) >> 9);
    lVar40 = *(long *)(pAVar44->enc_quant_dequant_params).quants.y_quant[0];
    local_350 = CONCAT44(local_350._4_4_,*(int *)&pAVar44->ppi);
    local_290 = *(int64_t *)&pAVar44->field_0x8;
    uVar37 = '\x01';
    none_rd_00 = part_search_state.split_rd;
    uVar71 = 0;
    lVar47 = 0;
    local_4f0 = 0;
    local_1d0 = lVar40;
    do {
      iVar70 = (int)uVar60;
      if (lVar40 <= (long)part_split_rd) goto LAB_001ecc80;
      iVar63 = ((uint)(uVar71 >> 1) & 0x7fffffff) * iVar25 + iVar27;
      bVar75 = false;
      if (iVar63 < (cpi->common).mi_params.mi_rows) {
        iVar66 = 0;
        if ((uVar71 & 1) != 0) {
          iVar66 = iVar25;
        }
        iVar66 = iVar66 + iVar26;
        pTVar68 = td;
        bVar75 = false;
        if (iVar66 < (cpi->common).mi_params.mi_cols) {
          uStack_560 = CONCAT17(uVar37,(undefined7)uStack_560);
          pPVar32 = pc_tree->split[uVar71];
          pPVar32->index = (int)uVar71;
          if (((((int)local_350 == 0x7fffffff) || (iVar70 == 0x7fffffff)) ||
              (lVar40 == 0x7fffffffffffffff)) ||
             ((local_290 == 0x7fffffffffffffff || (lVar47 == 0x7fffffffffffffff)))) {
            uStack_340 = 0x7fffffffffffffff;
            var_max = 1.06099789498857e-314;
            local_338 = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
            iStack_330 = -1;
            iStack_32c = 0x7fffffff;
            local_328 = 0;
          }
          else {
            lVar46 = (long)(td->mb).rdmult;
            lVar40 = local_290 - lVar47;
            uVar59 = (int)local_350 - iVar70;
            var_max._0_4_ = uVar59;
            uStack_340 = lVar40;
            if ((int)uVar59 < 0) {
              local_338 = (anon_struct_2_2_d7866a68 *)
                          (lVar40 * 0x80 - ((long)((ulong)-uVar59 * lVar46 + 0x100) >> 9));
            }
            else {
              local_338 = (anon_struct_2_2_d7866a68 *)
                          (lVar40 * 0x80 + ((long)((ulong)uVar59 * lVar46 + 0x100) >> 9));
            }
          }
          iVar54 = 0;
          if ((BVar23 < BLOCK_64X128) && (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
            iVar54 = (part_search_state.intra_part_info)->quad_tree_idx;
            (part_search_state.intra_part_info)->quad_tree_idx = (int)uVar71 + iVar54 * 4 + 1;
          }
          if (sms_tree == (SIMPLE_MOTION_DATA_TREE *)0x0) {
            sms_tree_00 = (SIMPLE_MOTION_DATA_TREE *)0x0;
          }
          else {
            sms_tree_00 = sms_tree->split[uVar71];
          }
          rect_part_win_info_00 = (RD_RECT_PART_WIN_INFO *)((long)none_rd_00 + -0x94);
          uVar24 = SUB81(rect_part_win_info_00,0);
          uVar79 = (undefined7)((ulong)rect_part_win_info_00 >> 8);
          best_rdc_00.rdcost._0_4_ = (int)local_338;
          best_rdc_00.rate = var_max._0_4_;
          best_rdc_00.zero_rate = var_max._4_4_;
          best_rdc_00.dist = uStack_340;
          best_rdc_00.rdcost._4_4_ = (int)((ulong)local_338 >> 0x20);
          best_rdc_00.sse._0_4_ = iStack_330;
          best_rdc_00.sse._4_4_ = iStack_32c;
          best_rdc_00._32_4_ = (int)CONCAT71(_aiStack_327,local_328);
          best_rdc_00._36_4_ = SUB74(_aiStack_327,3);
          local_1c8 = lVar47;
          _Var22 = av1_rd_pick_partition
                             (cpi,td,tile_data,tp,iVar63,iVar66,local_518,
                              &part_search_state.this_rdc,best_rdc_00,pPVar32,sms_tree_00,none_rd_00
                              ,multi_pass_mode,rect_part_win_info_00);
          td = pTVar80;
          if (_Var22) {
            if ((BVar23 < BLOCK_64X128) && (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
              (part_search_state.intra_part_info)->quad_tree_idx = iVar54;
            }
            uVar39 = iVar70 + part_search_state.this_rdc.rate;
            uVar59 = 0x7fffffff;
            uVar21 = '\0';
            if (uVar39 == 0x7fffffff) {
LAB_001ecbe4:
              part_split_rd = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
              iVar61 = 0x7fffffffffffffff;
              lVar47 = 0x7fffffffffffffff;
            }
            else {
              lVar40 = local_1c8 + part_search_state.this_rdc.dist;
              if (lVar40 == 0x7fffffffffffffff) goto LAB_001ecbe4;
              bVar75 = part_split_rd != (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
              part_split_rd = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
              iVar61 = 0x7fffffffffffffff;
              lVar47 = 0x7fffffffffffffff;
              if (bVar75) {
                lVar46 = (long)(td->mb).rdmult;
                iVar61 = local_4f0;
                lVar47 = lVar40;
                uVar59 = uVar39;
                uVar21 = uVar37;
                if ((int)uVar39 < 0) {
                  part_split_rd =
                       (anon_struct_2_2_d7866a68 *)
                       (lVar40 * 0x80 - ((long)(lVar46 * (ulong)-uVar39 + 0x100) >> 9));
                }
                else {
                  part_split_rd =
                       (anon_struct_2_2_d7866a68 *)
                       (lVar40 * 0x80 + ((long)(lVar46 * (ulong)uVar39 + 0x100) >> 9));
                }
              }
            }
            uVar37 = uVar21;
            pTVar68 = td;
            if (((uVar71 < 2) &&
                (((BVar23 < BLOCK_8X16 || (pc_tree->split[uVar71]->partitioning == '\0')) &&
                 (pPVar28 = pc_tree->split[uVar71]->none,
                 (pPVar28->mic).palette_mode_info.palette_size[0] == '\0')))) &&
               (((pPVar28->mic).palette_mode_info.palette_size[1] == '\0' &&
                ((pPVar28->mic).uv_mode != '\r')))) {
              part_search_state.is_split_ctx_is_ready[uVar71] = 1;
            }
          }
          else {
            uVar59 = 0x7fffffff;
            uVar37 = '\0';
            lVar47 = 0x7fffffffffffffff;
            iVar61 = 0x7fffffffffffffff;
            part_split_rd = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
          }
          uVar60 = (ulong)uVar59;
          lVar40 = local_1d0;
          pTVar80 = td;
          local_4f0 = iVar61;
          bVar75 = !_Var22;
        }
      }
      iVar70 = (int)uVar60;
      if (bVar75) goto LAB_001ecc80;
      uVar71 = uVar71 + 1;
      none_rd_00 = none_rd_00 + 1;
    } while (uVar71 != 4);
    uVar71 = 4;
LAB_001ecc80:
    if (((uint)uVar71 == 4) && ((long)part_split_rd < best_rdc.rdcost)) {
      lVar40 = lVar47 * 0x80 + ((long)(td->mb).rdmult * (long)iVar70 + 0x100 >> 9);
      if (lVar40 < best_rdc.rdcost) {
        best_rdc.rate = iVar70;
        best_rdc.zero_rate = 0;
        best_rdc.dist = lVar47;
        best_rdc.rdcost = lVar40;
        best_rdc.sse = local_4f0;
        best_rdc.skip_txfm = uVar37;
        uVar4 = var_max_1._0_4_;
        *(undefined4 *)((long)local_218 + 3) = var_max_1._3_4_;
        *local_218 = uVar4;
        part_search_state.found_best_partition = true;
        pc_tree->partitioning = '\x03';
      }
    }
    else {
      iVar25 = (cpi->sf).part_sf.less_rectangular_check_level;
      if ((0 < iVar25) && ((uint)uVar71 < 3 || iVar25 == 2)) {
        part_search_state.do_rectangular_split =
             part_search_state.do_rectangular_split &
             (uint)((long)part_split_rd <= part_search_state.none_rd ||
                   part_search_state.none_rd < 1);
      }
    }
    if ((BVar23 <= (td->mb).sb_enc.max_partition_size) ||
       (BVar23 == ((cpi->common).seq_params)->sb_size)) {
      bVar75 = ((cpi->common).seq_params)->monochrome == '\0';
      uVar24 = 0xa3;
      uVar79 = 0x1ecd;
      av1_restore_context(&td->mb,&x_ctx,iVar27,iVar26,BVar23,bVar75 + 1 + (uint)bVar75);
      td = pTVar80;
      pTVar80 = td;
    }
    paVar74 = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
    pPVar32 = pc_tree;
  }
  BVar23 = part_search_state.part_blk_params.bsize;
  iVar27 = part_search_state.part_blk_params.mi_col;
  iVar25 = part_search_state.part_blk_params.mi_row;
  if ((((local_2c8 == paVar74) && ((cpi->sf).part_sf.early_term_after_none_split != 0)) &&
      (part_split_rd == paVar74)) &&
     (((td->mb).must_find_valid_partition == 0 && (((cpi->common).seq_params)->sb_size != bsize))))
  {
    part_search_state.terminate_partition_search = 1;
  }
  if (((((1 < (cpi->sf).part_sf.skip_non_sq_part_based_on_none) &&
        (pPVar28 = pPVar32->none, pPVar28 != (PICK_MODE_CONTEXT *)0x0)) &&
       (((td->mb).qindex < 0xc9 && (bVar38 = (pPVar28->mic).mode, 0xf3 < (byte)(bVar38 - 0x19)))))
      && (((0x18 < bVar38 || ((0x1790000U >> (bVar38 & 0x1f) & 1) == 0)) &&
          (pPVar28->skippable != 0)))) &&
     ((BLOCK_16X8 < bsize && ((td->mb).must_find_valid_partition == 0)))) {
    part_search_state._296_8_ = part_search_state._296_8_ & 0xffffffff00000000;
  }
  if ((((cpi->sf).part_sf.ml_early_term_after_part_split_level != 0) &&
      (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
     ((part_search_state.terminate_partition_search == 0 &&
      ((part_search_state.do_rectangular_split != 0 &&
       (part_search_state.partition_rect_allowed[1] != 0 ||
        part_search_state.partition_rect_allowed[0] != 0)))))) {
    uVar24 = SUB81(&part_search_state,0);
    uVar79 = (undefined7)((ulong)&part_search_state >> 8);
    av1_ml_early_term_after_split
              (cpi,&td->mb,sms_tree,best_rdc.rdcost,(int64_t)local_2c8,(int64_t)part_split_rd,
               part_search_state.split_rd,&part_search_state);
    td = pTVar80;
    pTVar80 = td;
  }
  if (((((cpi->sf).part_sf.ml_early_term_after_part_split_level == 0) &&
       ((cpi->sf).part_sf.ml_prune_partition != 0)) &&
      (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
     (((part_search_state.partition_rect_allowed[1] != 0 ||
        part_search_state.partition_rect_allowed[0] != 0 &&
       (part_search_state.prune_rect_part[0] == 0)) &&
      ((part_search_state.prune_rect_part[1] == 0 &&
       (part_search_state.terminate_partition_search == 0)))))) {
    bVar75 = ((cpi->common).seq_params)->monochrome == '\0';
    av1_setup_src_planes(&td->mb,cpi->source,iVar25,iVar27,bVar75 + 1 + (uint)bVar75,BVar23);
    uVar24 = 0x14;
    uVar79 = 0x1ed7;
    td = pTVar80;
    av1_ml_prune_rect_partition
              (cpi,&pTVar80->mb,best_rdc.rdcost,part_search_state.none_rd,part_search_state.split_rd
               ,&part_search_state);
    pTVar80 = td;
  }
  BVar23 = part_search_state.part_blk_params.bsize;
  iVar27 = part_search_state.part_blk_params.mi_col;
  iVar25 = part_search_state.part_blk_params.mi_row;
  uVar71 = (ulong)part_search_state.part_blk_params.bsize;
  var_max._4_4_ = part_search_state.part_blk_params.mi_col;
  var_max._0_4_ = part_search_state.part_blk_params.mi_row;
  register0x00001248 = part_search_state.part_blk_params.mi_row_edge;
  register0x0000124c = part_search_state.part_blk_params.mi_col;
  local_338 = (anon_struct_2_2_d7866a68 *)
              CONCAT44(part_search_state.part_blk_params.mi_col,
                       part_search_state.part_blk_params.mi_row);
  iStack_330 = part_search_state.part_blk_params.mi_row;
  iStack_32c = part_search_state.part_blk_params.mi_col_edge;
  local_378._0_8_ =
       CONCAT44(part_search_state.part_blk_params.has_cols,
                part_search_state.part_blk_params.has_rows);
  var_max_1 = (double)local_2b8;
  local_270[0] = local_280;
  local_270[1] = local_2c0;
  local_270[2] = local_288;
  pdVar72 = &var_max_1;
  lVar40 = 0;
  do {
    if (((part_search_state.terminate_partition_search != 0) ||
        (part_search_state.partition_rect_allowed[lVar40] == 0)) ||
       (part_search_state.prune_rect_part[lVar40] != 0)) goto LAB_001ecfa9;
    if (part_search_state.do_rectangular_split == 0) {
      uVar24 = 0xd;
      uVar79 = 0x1ed0;
      td = pTVar80;
      iVar26 = (*(code *)(&PTR_av1_active_h_edge_005d19b0)[lVar40])
                         (cpi,*(int *)((long)(&var_max + lVar40 * 2) + lVar40 * 4),
                          part_search_state.part_blk_params.mi_step);
      pTVar80 = td;
      if (iVar26 == 0) goto LAB_001ecfa9;
    }
    local_350 = (ulong)(uint)(&DAT_004e4d88)[lVar40];
    bVar38 = (byte)(&DAT_004e4d88)[lVar40];
    BVar69 = BLOCK_INVALID;
    if (bVar38 == 0xff) goto LAB_001ed0ad;
    switch(uVar71) {
    case 0:
      bVar75 = false;
      uVar60 = uVar71;
      goto LAB_001ed091;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
switchD_001ed052_caseD_1:
      bVar75 = true;
      uVar60 = 6;
      goto LAB_001ed091;
    case 3:
      uVar60 = 1;
      break;
    case 6:
      uVar60 = 2;
      break;
    case 9:
      uVar60 = 3;
      break;
    default:
      if (BVar23 == BLOCK_64X64) {
        uVar60 = 4;
      }
      else {
        if (BVar23 != BLOCK_128X128) goto switchD_001ed052_caseD_1;
        uVar60 = 5;
      }
    }
    bVar75 = false;
LAB_001ed091:
    if (!bVar75) {
      BVar69 = subsize_lookup[bVar38][uVar60];
    }
LAB_001ed0ad:
    part_search_state.sum_rdc.rate = 0;
    part_search_state.sum_rdc.dist = 0;
    part_search_state.sum_rdc.rdcost = 0;
    part_search_state.sum_rdc.sse = 0;
    part_search_state.sum_rdc.skip_txfm = '\x01';
    part_search_state.sum_rdc.zero_rate = 0;
    lVar47 = 0;
    do {
      plVar6 = (long *)pdVar72[lVar47];
      if (*plVar6 == 0) {
        td = pTVar80;
        pPVar28 = av1_alloc_pmc(cpi,BVar69,local_2b0);
        *plVar6 = (long)pPVar28;
        pTVar80 = td;
        if (pPVar28 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
          pTVar80 = td;
        }
      }
      lVar47 = lVar47 + 1;
    } while (lVar47 == 1);
    pTVar68 = (ThreadData_conflict *)(ulong)bVar38;
    part_search_state.sum_rdc.rate = part_search_state.partition_cost[(long)pTVar68];
    part_search_state.sum_rdc.rdcost =
         (long)(td->mb).rdmult * (long)part_search_state.partition_cost[(long)pTVar68] + 0x100 >> 9;
    ppPVar31 = local_270[lVar40 * 2 + -1];
    rd_pick_rect_partition
              (cpi,tile_data,&td->mb,*ppPVar31,&part_search_state,&best_rdc,0,
               *(int *)(&var_max + lVar40 * 2),*(int *)((long)&var_max + lVar40 * 0x10 + 4),BVar69,
               bVar38);
    iVar61 = best_rdc.rdcost;
    td = pTVar80;
    if ((part_search_state.sum_rdc.rdcost < best_rdc.rdcost) &&
       (*(int *)(local_378 + lVar40 * 4) != 0)) {
      pPVar28 = *ppPVar31;
      if (((pPVar28->mic).palette_mode_info.palette_size[0] == '\0') &&
         (((pPVar28->mic).palette_mode_info.palette_size[1] == '\0' &&
          ((pPVar28->mic).uv_mode != '\r')))) {
        part_search_state.is_rect_ctx_is_ready[lVar40] = 1;
      }
      local_2c8 = (anon_struct_2_2_d7866a68 *)(local_270 + lVar40 * 2 + -1);
      av1_update_state(cpi,pTVar80,pPVar28,iVar25,iVar27,BVar69,'\x01');
      encode_superblock(cpi,tile_data,pTVar80,tp,'\x01',BVar69,(int *)pTVar80);
      rd_pick_rect_partition
                (cpi,tile_data,&pTVar80->mb,
                 *(PICK_MODE_CONTEXT **)&(*(PICK_MODE_CONTEXT **)(local_2c8 + 4))->mic,
                 &part_search_state,&best_rdc,1,*(int *)(&uStack_340 + lVar40 * 2),
                 *(int *)((long)&uStack_340 + lVar40 * 0x10 + 4),BVar69,bVar38);
      td = pTVar80;
    }
    if (part_search_state.sum_rdc.rdcost < iVar61) {
      part_search_state.sum_rdc.rdcost =
           part_search_state.sum_rdc.dist * 0x80 +
           ((long)(td->mb).rdmult * (long)part_search_state.sum_rdc.rate + 0x100 >> 9);
      if (part_search_state.sum_rdc.rdcost < iVar61) {
        best_rdc.skip_txfm = part_search_state.sum_rdc.skip_txfm;
        best_rdc._33_7_ =
             SUB87(CONCAT44(part_search_state.sum_rdc._36_4_,part_search_state.sum_rdc._32_4_) >> 8,
                   0);
        best_rdc.sse = part_search_state.sum_rdc.sse;
        best_rdc.rate = part_search_state.sum_rdc.rate;
        best_rdc.zero_rate = part_search_state.sum_rdc.zero_rate;
        best_rdc.dist = part_search_state.sum_rdc.dist;
        part_search_state.found_best_partition = true;
        pc_tree->partitioning = (PARTITION_TYPE)local_350;
        best_rdc.rdcost = part_search_state.sum_rdc.rdcost;
      }
    }
    else if (rect_part_win_info != (RD_RECT_PART_WIN_INFO *)0x0) {
      rect_part_win_info->rect_part_win[lVar40] = 0;
    }
    bVar75 = ((cpi->common).seq_params)->monochrome == '\0';
    uVar24 = 0xbb;
    uVar79 = 0x1ed3;
    av1_restore_context(&td->mb,&x_ctx,iVar25,iVar27,BVar23,bVar75 + 1 + (uint)bVar75);
    pPVar32 = pc_tree;
    pTVar80 = td;
LAB_001ecfa9:
    pdVar72 = pdVar72 + 2;
    bVar75 = lVar40 == 0;
    lVar40 = lVar40 + 1;
  } while (bVar75);
  if (local_4d8 == 0xffffffff) {
    av1_setup_src_planes(&td->mb,cpi->source,mi_row,mi_col,iVar65,bsize);
    uVar24 = 0x12;
    uVar79 = 0x1ed4;
    td = pTVar80;
    local_4d8 = av1_get_perpixel_variance_facade(cpi,local_1e8,local_1f0,bsize,0);
    pTVar80 = td;
  }
  BVar69 = part_search_state.part_blk_params.split_bsize2;
  BVar23 = part_search_state.part_blk_params.bsize;
  iVar26 = part_search_state.part_blk_params.mi_row_edge;
  iVar27 = part_search_state.part_blk_params.mi_col;
  iVar25 = (td->mb).must_find_valid_partition;
  if ((((pPVar32->none == (PICK_MODE_CONTEXT *)0x0) ||
       ((cpi->sf).part_sf.skip_non_sq_part_based_on_none < 1)) || (bsize < BLOCK_16X16)) ||
     ((iVar25 != 0 || (pPVar32->none->skippable == 0)))) {
    bVar38 = 1;
    local_540 = 0;
  }
  else {
    bVar38 = 0;
    local_540 = 1;
  }
  _Var22 = true;
  if (best_rdc.rdcost != 0x7fffffffffffffff) {
    BVar57 = (BLOCK_SIZE)*(undefined4 *)&(cpi->sf).part_sf.ext_partition_eval_thresh;
    BVar56 = BLOCK_128X128;
    if ((cpi->sf).part_sf.ext_part_eval_based_on_cur_best == 0) {
      BVar56 = BVar57;
    }
    if (iVar25 != 0) {
      BVar56 = BVar57;
    }
    if ((byte)(pPVar32->partitioning - 1) < 2) {
      BVar56 = BVar57;
    }
    _Var22 = false;
    if ((part_search_state.do_rectangular_split != 0) &&
       (BVar56 < part_search_state.part_blk_params.bsize)) {
      _Var22 = (_Bool)((part_search_state.part_blk_params.has_cols != 0 &&
                       part_search_state.part_blk_params.has_rows != 0) & bVar38);
    }
  }
  if (part_search_state.terminate_partition_search == 0) {
    uVar60 = (ulong)part_search_state.part_blk_params.bsize;
    local_518 = (BLOCK_SIZE)part_search_state.part_blk_params.mi_row;
    uStack_517 = (undefined7)
                 (CONCAT44(part_search_state.part_blk_params.mi_col,
                           part_search_state.part_blk_params.mi_row) >> 8);
    uStack_510 = (undefined6)
                 CONCAT44(part_search_state.part_blk_params.mi_col_edge,
                          part_search_state.part_blk_params.mi_row_edge);
    uStack_50a = (undefined1)((uint)part_search_state.part_blk_params.mi_col_edge >> 0x10);
    uStack_509 = (undefined1)((uint)part_search_state.part_blk_params.mi_col_edge >> 0x18);
    part_state = &part_search_state;
    uVar71 = best_rdc.rdcost;
    av1_prune_ab_partitions
              (cpi,&td->mb,pPVar32,local_4d8,best_rdc.rdcost,rect_part_win_info,_Var22,part_state,
               ab_partitions_allowed);
    td = pTVar80;
    local_238 = part_search_state.is_split_ctx_is_ready[0];
    local_234[1] = part_search_state.is_rect_ctx_is_ready[0];
    local_234[0] = part_search_state.is_split_ctx_is_ready[1];
    local_22c[0] = 0;
    local_22c[1] = 0;
    local_228 = part_search_state.is_split_ctx_is_ready[0];
    local_224[0] = 0;
    local_224[1] = 0;
    local_220 = part_search_state.is_rect_ctx_is_ready[1];
    local_21c[0] = 0;
    local_21c[1] = 0;
    cur_part_ctxs[0] = local_1f8;
    cur_part_ctxs[1] = local_200;
    cur_part_ctxs[2] = local_208;
    cur_part_ctxs[3] = local_210;
    local_270[1] = local_2b8;
    local_270[5] = local_2c0;
    if (part_search_state.is_split_ctx_is_ready[0] != 0) {
      var_max_1 = (double)&pPVar32->split[0]->none;
      local_270[3] = (PICK_MODE_CONTEXT **)var_max_1;
    }
    if (part_search_state.is_split_ctx_is_ready[1] != 0) {
      local_270[0] = &pPVar32->split[1]->none;
    }
    local_4cc[0] = BVar69;
    local_4cc[1] = BVar69;
    switch(uVar60) {
    case 0:
      bVar75 = false;
      uVar64 = uVar60;
      goto LAB_001ed755;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
switchD_001ed653_caseD_1:
      bVar75 = true;
      uVar64 = 6;
      goto LAB_001ed755;
    case 3:
      uVar64 = 1;
      break;
    case 6:
      uVar64 = 2;
      break;
    case 9:
      uVar64 = 3;
      break;
    default:
      if (BVar23 == BLOCK_64X64) {
        uVar64 = 4;
      }
      else {
        if (BVar23 != BLOCK_128X128) goto switchD_001ed653_caseD_1;
        uVar64 = 5;
      }
    }
    bVar75 = false;
LAB_001ed755:
    local_4cc[2] = BLOCK_INVALID;
    if (!bVar75) {
      local_4cc[2] = subsize_lookup[4][uVar64];
    }
    switch(uVar60) {
    case 0:
      bVar75 = false;
      uVar64 = uVar60;
      goto LAB_001ed7c5;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
switchD_001ed784_caseD_1:
      bVar75 = true;
      uVar64 = 6;
      goto LAB_001ed7c5;
    case 3:
      uVar64 = 1;
      break;
    case 6:
      uVar64 = 2;
      break;
    case 9:
      uVar64 = 3;
      break;
    default:
      if (BVar23 == BLOCK_64X64) {
        uVar64 = 4;
      }
      else {
        if (BVar23 != BLOCK_128X128) goto switchD_001ed784_caseD_1;
        uVar64 = 5;
      }
    }
    bVar75 = false;
LAB_001ed7c5:
    local_4cc[3] = BLOCK_INVALID;
    if (!bVar75) {
      local_4cc[3] = subsize_lookup[5][uVar64];
    }
    auVar77 = pshuflw(ZEXT216(CONCAT11(BVar69,BVar69)),ZEXT216(CONCAT11(BVar69,BVar69)),0);
    local_4cc._4_4_ = auVar77._0_4_;
    switch(uVar60) {
    case 0:
      bVar75 = false;
      uVar64 = uVar60;
      goto LAB_001ed84f;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
switchD_001ed80e_caseD_1:
      bVar75 = true;
      uVar64 = 6;
      goto LAB_001ed84f;
    case 3:
      uVar64 = 1;
      break;
    case 6:
      uVar64 = 2;
      break;
    case 9:
      uVar64 = 3;
      break;
    default:
      if (BVar23 == BLOCK_64X64) {
        uVar64 = 4;
      }
      else {
        if (BVar23 != BLOCK_128X128) goto switchD_001ed80e_caseD_1;
        uVar64 = 5;
      }
    }
    bVar75 = false;
LAB_001ed84f:
    local_4cc[8] = BLOCK_INVALID;
    if (!bVar75) {
      local_4cc[8] = subsize_lookup[6][uVar64];
    }
    switch(uVar60) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
switchD_001ed888_caseD_1:
      uVar60 = 6;
      bVar75 = true;
      goto LAB_001ed8c9;
    case 3:
      uVar60 = 1;
      break;
    case 6:
      uVar60 = 2;
      break;
    case 9:
      uVar60 = 3;
      break;
    default:
      if (BVar23 != BLOCK_64X64) {
        if (BVar23 != BLOCK_128X128) goto switchD_001ed888_caseD_1;
        uVar60 = 5;
        break;
      }
      uVar60 = 4;
      bVar75 = false;
      goto LAB_001ed8c9;
    }
    bVar75 = false;
LAB_001ed8c9:
    local_4cc[9] = BLOCK_INVALID;
    if (!bVar75) {
      local_4cc[9] = subsize_lookup[7][uVar60];
    }
    local_4cc[10] = BVar69;
    local_4cc[0xb] = BVar69;
    uVar11 = CONCAT71(uStack_517,local_518);
    auVar14._8_6_ = uStack_510;
    auVar14._0_8_ = uVar11;
    auVar77[0xe] = uStack_50a;
    auVar77._0_14_ = auVar14;
    auVar77[0xf] = uStack_509;
    iStack_330 = (int)uVar11;
    iStack_32c = iVar27;
    register0x00001208 = iStack_330;
    var_max = (double)uVar11;
    register0x0000120c = auVar77._12_4_;
    local_338 = (anon_struct_2_2_d7866a68 *)CONCAT44(iVar27,iVar26);
    auVar78._0_12_ = auVar14._0_12_;
    auVar78._12_4_ = iVar27;
    local_328 = (undefined1)iVar26;
    _aiStack_327 = auVar78._9_7_;
    local_320._0_8_ = auVar77._8_8_;
    local_320._8_4_ = iStack_330;
    local_320._12_4_ = iVar27;
    local_310._4_4_ = iVar27;
    local_310._0_4_ = iVar26;
    local_310._8_4_ = iStack_330;
    local_310._12_4_ = auVar77._12_4_;
    local_300 = _var_max;
    local_2f0._0_2_ = (int16_t)local_320._0_8_;
    local_2f0._2_2_ = SUB82(local_320._0_8_,2);
    local_2f0._4_2_ = SUB82(local_320._0_8_,4);
    local_2f0._6_2_ = SUB82(local_320._0_8_,6);
    paVar74 = (anon_struct_2_2_d7866a68 *)((long)&var_max + 4);
    __s = (AV1_COMP *)local_4cc;
    pAVar44 = (AV1_COMP *)0x0;
    pTVar62 = td;
LAB_001ed967:
    if (ab_partitions_allowed[(long)pAVar44] == 0) goto LAB_001edf83;
    __n_00 = (anon_struct_2_2_d7866a68 *)((ulong)pAVar44 | 4);
    lVar40 = 0;
    do {
      uVar24 = 0x96;
      uVar79 = 0x1ed9;
      dst_ctx = (BLOCK_SIZE (*) [6])cpi;
      pPVar28 = av1_alloc_pmc(cpi,*(BLOCK_SIZE *)
                                   ((long)((__s->enc_quant_dequant_params).quants.y_quant + -1) +
                                   lVar40),local_2b0);
      part_split_rd = (anon_struct_2_2_d7866a68 *)cur_part_ctxs[(long)pAVar44];
      *(PICK_MODE_CONTEXT **)(part_split_rd + lVar40 * 4) = pPVar28;
      __n = extraout_RDX;
      if (pPVar28 == (PICK_MODE_CONTEXT *)0x0) {
        dst_ctx = (BLOCK_SIZE (*) [6])(pTVar62->mb).e_mbd.error_info;
        uVar24 = 0xc5;
        uVar79 = 0x1ed9;
        aom_internal_error((aom_internal_error_info *)dst_ctx,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
        __n = extraout_RDX_00;
      }
      *(undefined4 *)(*(long *)(part_split_rd + lVar40 * 4) + 0x1d0) = 0;
      lVar40 = lVar40 + 1;
    } while (lVar40 != 3);
    PVar53 = (PARTITION_TYPE)__n_00;
    cpi_00 = (AV1_COMP *)0x3;
    if (((cpi->sf).part_sf.reuse_prev_rd_results_for_part_ab != 0) &&
       ((&local_238)[(long)pAVar44 * 2] != 0)) {
      dst_ctx = *(BLOCK_SIZE (**) [6])part_split_rd;
      cpi_00 = (AV1_COMP *)((long)pAVar44 * 0x10);
      uVar24 = 0xf;
      uVar79 = 0x1eda;
      av1_copy_tree_context
                ((PICK_MODE_CONTEXT *)dst_ctx,*(PICK_MODE_CONTEXT **)(&var_max_1)[(long)pAVar44 * 2]
                );
      pPVar28 = *(PICK_MODE_CONTEXT **)part_split_rd;
      (pPVar28->mic).partition = PVar53;
      pPVar28->rd_mode_is_ready = 1;
      __n = extraout_RDX_01;
      if (local_234[(long)pAVar44 * 2] != 0) {
        dst_ctx = *(BLOCK_SIZE (**) [6])(part_split_rd + 4);
        uVar24 = 0x45;
        uVar79 = 0x1eda;
        av1_copy_tree_context((PICK_MODE_CONTEXT *)dst_ctx,*local_270[(long)pAVar44 * 2]);
        pPVar28 = *(PICK_MODE_CONTEXT **)(part_split_rd + 4);
        (pPVar28->mic).partition = PVar53;
        pPVar28->rd_mode_is_ready = 1;
        __n = extraout_RDX_02;
      }
    }
    BVar23 = part_search_state.part_blk_params.bsize;
    iVar27 = part_search_state.part_blk_params.mi_col;
    iVar25 = part_search_state.part_blk_params.mi_row;
    local_2e8 = (undefined1  [16])0x0;
    local_2d8 = (PICK_MODE_CONTEXT *)0x0;
    if ((cpi->sf).part_sf.reuse_best_prediction_for_part_ab == 0) goto LAB_001edc43;
    puVar41 = &switchD_001eda98::switchdataD_004e4800;
    lVar40 = (long)(int)(&switchD_001eda98::switchdataD_004e4800)[(ulong)pAVar44 & 0xff];
    piVar30 = (int *)((long)&switchD_001eda98::switchdataD_004e4800 + lVar40);
    uVar55 = (uint)__n_00;
    bVar38 = (byte)piVar30;
    uVar59 = (uint)piVar30;
    uVar35 = (undefined7)((ulong)piVar30 >> 8);
    uVar39 = (uint)cpi_00;
    puVar49 = (undefined8 *)&stack0xfffffffffffffa98;
    puVar50 = &stack0xfffffffffffffa98;
    pTVar80 = pTVar62;
    switch((ulong)pAVar44 & 0xff) {
    case 0:
      if (((pc_tree->split[0] == (PC_TREE *)0x0) ||
          (local_2e8._0_8_ = pc_tree->split[0]->none,
          (PICK_MODE_CONTEXT *)local_2e8._0_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
         ((((PICK_MODE_CONTEXT *)local_2e8._0_8_)->rd_stats).rate == 0x7fffffff)) {
        local_2e8._0_8_ = (PICK_MODE_CONTEXT *)0x0;
      }
      if (((pc_tree->split[1] == (PC_TREE *)0x0) ||
          (local_2e8._8_8_ = pc_tree->split[1]->none,
          (PICK_MODE_CONTEXT *)local_2e8._8_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
         ((((PICK_MODE_CONTEXT *)local_2e8._8_8_)->rd_stats).rate == 0x7fffffff)) {
        local_2e8._8_8_ = (PICK_MODE_CONTEXT *)0x0;
      }
      ppPVar31 = local_280;
      goto LAB_001edb78;
    case 1:
      local_2e8._0_8_ = *local_2b8;
      if (((PICK_MODE_CONTEXT *)local_2e8._0_8_ == (PICK_MODE_CONTEXT *)0x0) ||
         ((((PICK_MODE_CONTEXT *)local_2e8._0_8_)->rd_stats).rate == 0x7fffffff)) {
        local_2e8._0_8_ = (PICK_MODE_CONTEXT *)0x0;
      }
      pPVar32 = pc_tree->split[2];
      goto LAB_001edbec;
    case 2:
      if (((pc_tree->split[0] == (PC_TREE *)0x0) ||
          (local_2e8._0_8_ = pc_tree->split[0]->none,
          (PICK_MODE_CONTEXT *)local_2e8._0_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
         ((((PICK_MODE_CONTEXT *)local_2e8._0_8_)->rd_stats).rate == 0x7fffffff)) {
        local_2e8._0_8_ = (PICK_MODE_CONTEXT *)0x0;
      }
      if (((pc_tree->split[2] == (PC_TREE *)0x0) ||
          (local_2e8._8_8_ = pc_tree->split[2]->none,
          (PICK_MODE_CONTEXT *)local_2e8._8_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
         ((((PICK_MODE_CONTEXT *)local_2e8._8_8_)->rd_stats).rate == 0x7fffffff)) {
        local_2e8._8_8_ = (PICK_MODE_CONTEXT *)0x0;
      }
      ppPVar31 = local_288;
LAB_001edb78:
      local_2d8 = *ppPVar31;
LAB_001edc28:
      if ((local_2d8 == (PICK_MODE_CONTEXT *)0x0) || ((local_2d8->rd_stats).rate == 0x7fffffff)) {
LAB_001edc39:
        local_2d8 = (PICK_MODE_CONTEXT *)0x0;
      }
LAB_001edc43:
      uVar71 = (ulong)part_search_state.part_blk_params.bsize;
      lVar40 = (ulong)""[uVar71] - 1;
      local_360 = 0;
      local_358 = '\x01';
      local_378._0_4_ =
           *(uint *)((long)local_1c0 +
                    (long)__n_00 * 4 +
                    ((ulong)((uint)(((uint)(int)(pTVar62->mb).e_mbd.above_partition_context
                                                [part_search_state.part_blk_params.mi_col] >>
                                     ((uint)lVar40 & 0x1f) & 1) != 0) +
                            ((uint)(int)(pTVar62->mb).e_mbd.left_partition_context
                                        [part_search_state.part_blk_params.mi_row & 0x1f] >>
                             ((byte)lVar40 & 0x1f) & 1) * 2) + (ulong)""[uVar71] * 4 + -4) * 0x28);
      local_378._4_4_ = 0;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (long)(pTVar62->mb).rdmult * (long)(int)local_378._0_4_ + 0x100 >> 9;
      stack0xfffffffffffffc90 = auVar18 << 0x40;
      lVar40 = 0;
      td = pTVar62;
      do {
        pMVar7 = *(MB_MODE_INFO **)(local_2e8 + lVar40 * 8);
        if (pMVar7 != (MB_MODE_INFO *)0x0) {
          (td->mb).use_mb_mode_cache = 1;
          (td->mb).mb_mode_cache = pMVar7;
        }
        part_state = (PartitionSearchState *)&best_rdc;
        best_rdcost.zero_rate = best_rdc.zero_rate;
        best_rdcost.rate = best_rdc.rate;
        best_rdcost.dist._0_4_ = (int)best_rdc.dist;
        best_rdcost.dist._4_4_ = (int)((ulong)best_rdc.dist >> 0x20);
        best_rdcost.rdcost._0_4_ = (int)best_rdc.rdcost;
        best_rdcost.rdcost._4_4_ = (int)((ulong)best_rdc.rdcost >> 0x20);
        best_rdcost.sse._0_4_ = (int)best_rdc.sse;
        best_rdcost.sse._4_4_ = (int)((ulong)best_rdc.sse >> 0x20);
        best_rdcost._32_4_ = (int)CONCAT71(best_rdc._33_7_,best_rdc.skip_txfm);
        best_rdcost._36_4_ = best_rdc._36_4_;
        iVar26 = rd_try_subblock(cpi,td,tile_data,tp,(uint)(lVar40 == 2),
                                 *(int *)((long)((PC_TREE *)paVar74)->horizontal +
                                         lVar40 * 8 + -0x14),
                                 *(int *)(((PC_TREE *)paVar74)->horizontal + lVar40 + -2),
                                 *(BLOCK_SIZE *)
                                  ((long)((__s->enc_quant_dequant_params).quants.y_quant + -1) +
                                  lVar40),best_rdcost,(RD_STATS *)local_378,(byte)pAVar44 | 4,
                                 *(PICK_MODE_CONTEXT **)(part_split_rd + lVar40 * 4));
        (td->mb).use_mb_mode_cache = 0;
        (td->mb).mb_mode_cache = (MB_MODE_INFO *)0x0;
        if (iVar26 == 0) {
          bVar38 = 0;
          goto LAB_001edf45;
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != 3);
      lVar40 = (long)(td->mb).rdmult;
      if ((((local_378._0_8_ & 0xffffffff) == 0x7fffffff) || (local_378._8_8_ == 0x7fffffffffffffff)
          ) || (lStack_368 == 0x7fffffffffffffff)) {
        local_378._0_8_ = 0x7fffffff;
        lStack_368 = 0x7fffffffffffffff;
        local_378._8_8_ = 0x7fffffffffffffff;
        local_360 = 0x7fffffffffffffff;
        local_358 = '\0';
      }
      else {
        if ((int)local_378._0_4_ < 0) {
          lStack_368 = local_378._8_8_ * 0x80 -
                       ((long)((ulong)(uint)-local_378._0_4_ * lVar40 + 0x100) >> 9);
        }
        else {
          lStack_368 = local_378._8_8_ * 0x80 +
                       ((long)((local_378._0_8_ & 0xffffffff) * lVar40 + 0x100) >> 9);
        }
      }
      if (lStack_368 < best_rdc.rdcost) {
        lStack_368 = local_378._8_8_ * 0x80 + ((int)local_378._0_4_ * lVar40 + 0x100 >> 9);
        if (best_rdc.rdcost <= lStack_368) goto LAB_001edf43;
        best_rdc.skip_txfm = local_358;
        best_rdc._33_7_ = _aiStack_357;
        best_rdc.sse = local_360;
        best_rdc.zero_rate = SUB84(local_378._0_8_,4);
        best_rdc.dist = local_378._8_8_;
        pc_tree->partitioning = PVar53;
        bVar38 = 1;
        best_rdc.rate = local_378._0_4_;
        best_rdc.rdcost = lStack_368;
      }
      else {
LAB_001edf43:
        bVar38 = 0;
      }
LAB_001edf45:
      part_search_state.found_best_partition =
           (_Bool)(part_search_state.found_best_partition | bVar38);
      bVar75 = ((cpi->common).seq_params)->monochrome == '\0';
      uVar24 = 0x7f;
      uVar79 = 0x1edf;
      av1_restore_context(&td->mb,&x_ctx,iVar25,iVar27,BVar23,bVar75 + 1 + (uint)bVar75);
      pTVar62 = td;
LAB_001edf83:
      pAVar44 = (AV1_COMP *)((long)&pAVar44->ppi + 1);
      __s = (AV1_COMP *)((long)&__s->ppi + 3);
      paVar74 = (anon_struct_2_2_d7866a68 *)(((PC_TREE *)paVar74)->horizontal + 1);
      pPVar32 = pc_tree;
      pTVar80 = pTVar62;
      if (pAVar44 == (AV1_COMP *)&DAT_00000004) goto LAB_001edfad;
      goto LAB_001ed967;
    case 3:
      local_2e8._0_8_ = *local_2c0;
      if (((PICK_MODE_CONTEXT *)local_2e8._0_8_ == (PICK_MODE_CONTEXT *)0x0) ||
         ((((PICK_MODE_CONTEXT *)local_2e8._0_8_)->rd_stats).rate == 0x7fffffff)) {
        local_2e8._0_8_ = (PICK_MODE_CONTEXT *)0x0;
      }
      pPVar32 = pc_tree->split[1];
LAB_001edbec:
      if (((pPVar32 == (PC_TREE *)0x0) ||
          (local_2e8._8_8_ = pPVar32->none,
          (PICK_MODE_CONTEXT *)local_2e8._8_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
         ((((PICK_MODE_CONTEXT *)local_2e8._8_8_)->rd_stats).rate == 0x7fffffff)) {
        local_2e8._8_8_ = (PICK_MODE_CONTEXT *)0x0;
      }
      if (pc_tree->split[3] != (PC_TREE *)0x0) {
        local_2d8 = pc_tree->split[3]->none;
        goto LAB_001edc28;
      }
      goto LAB_001edc39;
    case 4:
      __n = &switchD_001ee0ad::switchdataD_004e4810;
      goto code_r0x001ee09c;
    default:
      piVar30 = (int *)((ulong)piVar30 | 0x74);
      piVar2 = cpi_00[0xdc].enc_quant_dequant_params.quants.y_round[0xe2] + 7;
      *(byte *)piVar2 = (byte)*piVar2 ^ (byte)piVar30;
      goto code_r0x001ee0c2;
    case 7:
      *(byte *)piVar30 = (char)*piVar30 + bVar38;
      switchD_001ed80e::switchdataD_004e47b0._2_1_ = bVar38 - 0x30;
      cpi_00 = (AV1_COMP *)(ulong)(uVar39 + uVar55);
      unique0x00006b00 = uVar59 & 0x8affd090;
      iVar25 = *piVar30;
      piVar30 = (int *)(ulong)(uVar59 + iVar25);
      *(char *)piVar30 = (char)*piVar30 + (char)(uVar59 + iVar25);
    case 10:
      goto switchD_001eda98_caseD_a;
    case 0xd:
      *(byte *)piVar30 = (char)*piVar30 + bVar38;
      ram0x004e47b9 = -0x75002f70 - uVar59;
      halt_baddata();
    case 0xe:
      __n = (uint *)(ulong)((uint)__n + (int)pTVar62);
      puVar50 = &stack0xfffffffffffffa98;
      goto switchD_001eda98_caseD_14;
    case 0xf:
    case 0x10:
    case 0x12:
    case 0x13:
    case 0x15:
    case 0x16:
      puVar48 = (undefined1 *)0xf024;
      *(byte *)&cpi_00->ppi = *(char *)&cpi_00->ppi + bVar38;
      goto code_r0x001ee632;
    case 0x11:
      in(0xe9);
      puVar48 = (undefined1 *)0x41000000;
      goto LAB_001ee622;
    case 0x14:
      goto switchD_001eda98_caseD_14;
    case 0x17:
      goto switchD_001eda98_caseD_17;
    case 0x18:
      piVar30 = (int *)((ulong)piVar30 & 0xffffffffffffff30);
      *piVar30 = *piVar30 + (int)piVar30;
      *(char *)((long)piVar30 + -0x77) = *(char *)((long)piVar30 + -0x77);
      *(char *)piVar30 = (char)*piVar30 + (char)piVar30;
      switchD_001ed784::switchdataD_004e4788._3_1_ = (char)piVar30 + -1;
      goto code_r0x001ee8ff;
    case 0x19:
    case 0x1a:
    case 0x1c:
    case 0x1d:
    case 0x1f:
    case 0x20:
code_r0x001ee8ff:
      uVar71 = (ulong)(part_state->part_blk_params).bsize;
      uVar11._0_4_ = (((AV1_COMP *)dst_ctx)->common).mi_params.mi_rows;
      uVar11._4_4_ = (((AV1_COMP *)dst_ctx)->common).mi_params.mi_cols;
      part_search_state.part_blk_params.min_partition_size_1d = (int)uVar11;
      part_search_state.part_blk_params.bsize_at_least_8x8 = uVar11._4_4_;
      piVar30 = (int *)CONCAT71(SUB87(uVar11,1),0xff);
      dst_ctx = (BLOCK_SIZE (*) [6])0xff;
      break;
    case 0x1b:
      break;
    case 0x1e:
      piVar45 = (int *)((long)&UINT_004e47b4 + lVar40 + 3);
      *piVar45 = *piVar45 + 1;
      iRam00000000018767c1 = iRam00000000018767c1 + 1;
      goto code_r0x001ee91b;
    case 0x21:
      LOCK();
      puVar41 = (uint *)((long)piVar30 * 8 + -0x7669b7fd);
      uVar59 = *puVar41;
      *puVar41 = (uint)__n;
      __n = (uint *)(ulong)uVar59;
      UNLOCK();
      break;
    case 0x22:
      *(byte *)piVar30 = (char)*piVar30 + bVar38;
      ((MB_MODE_INFO *)&((AV1_COMP *)dst_ctx)->ppi)->bsize =
           (char)*(aom_codec_err_t *)&((MB_MODE_INFO *)&((AV1_COMP *)dst_ctx)->ppi)->bsize;
      UINT_004e480c._3_1_ = 0xff;
      halt_baddata();
    case 0x23:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x29:
    case 0x2a:
      if (piVar30 != (int *)0x0) goto code_r0x001ee98b;
      cRam0000000000000000 = bVar38 * '\x02';
      piVar33 = (int *)&stack0xfffffffffffffa98;
      goto LAB_001ee99f;
    case 0x25:
      *(byte *)piVar30 = (char)*piVar30 + bVar38;
      cVar43 = (char)(char *)((ulong)piVar30 | 0xba) + *(char *)((ulong)piVar30 | 0xba);
      piVar30 = (int *)CONCAT71(uVar35,cVar43);
      *(char *)piVar30 = (char)*piVar30 + cVar43;
      goto LAB_001ee980;
    case 0x28:
      piVar30 = (int *)(ulong)(bVar38 ^ 0x77);
      goto code_r0x001ee997;
    case 0x2b:
      puVar51 = &stack0xfffffffffffffa98;
      goto code_r0x001ee997;
    case 0x2c:
      dst_ctx = (BLOCK_SIZE (*) [6])(ulong)(((char)dst_ctx - 0xfU & 0xf7) != 0);
      if (1 < *(byte *)(uVar71 + 0x20 + (long)td * 4)) goto switchD_001eda98_caseD_2d;
      goto LAB_001eff5f;
    case 0x2d:
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x33:
    case 0x34:
switchD_001eda98_caseD_2d:
      if ((char)dst_ctx == '\0') {
        bVar38 = (byte)pTVar62;
        goto code_r0x001f004b;
      }
LAB_001eff5f:
      BVar23 = *(BLOCK_SIZE *)&(pTVar68->mb).plane[0].src_diff;
      bVar38 = block_size_high[BVar23];
      if (block_size_wide[BVar23] < block_size_high[BVar23]) {
        bVar38 = block_size_wide[BVar23];
      }
      if (((7 < bVar38) &&
          (0xf3 < (byte)(*(char *)((long)&(pTVar68->mb).plane[0].src_diff + 2) - 0x19U))) &&
         (*(char *)((long)&(pTVar68->mb).plane[0].qcoeff + 1) < '\0')) {
        piVar30 = (int *)0x0;
      }
LAB_001f0051:
      if (((char)piVar30 == '\0') && (*(char *)((long)&(pTVar68->mb).plane[0].qcoeff + 1) != '\0'))
      {
        piVar33 = (int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].lps_cost + 3) + 0x50U
                         + (ulong)(*(char *)&(pTVar68->mb).plane[0].coeff == '\x01') * 4 +
                           (long)__s * 8);
        *piVar33 = *piVar33 + 1;
      }
      puVar49 = *(undefined8 **)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x16] + 4);
      lVar40 = **(long **)((cpi_00->enc_quant_dequant_params).quants.y_zbin[4] + 4);
      bVar38 = *(byte *)(lVar40 + 0x10);
      cVar43 = *(char *)(lVar40 + 0x11);
      if (cVar43 < '\x01') goto LAB_001efc11;
      cVar58 = -1;
      if ('\x04' < cVar43 && (char)bVar38 < '\x05') goto LAB_001efbfa;
      lVar40 = 0;
      goto LAB_001ef9f6;
    case 0x2f:
      halt_baddata();
    case 0x32:
      halt_baddata();
    case 0x35:
      bVar38 = (byte)((ulong)__n >> 8);
code_r0x001f004b:
      if (bVar38 < 8) goto LAB_001eff5f;
      goto LAB_001f0051;
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x3e:
    case 0x3f:
      halt_baddata();
    case 0x39:
      goto LAB_001f0114;
    case 0x3a:
      goto switchD_001eda98_caseD_3a;
    case 0x3b:
      paVar52 = partition_context_lookup;
      __n_00 = part_split_rd;
      goto code_r0x001f018a;
    case 0x3c:
      goto code_r0x001f02e6;
    case 0x3d:
      *(byte *)piVar30 = (char)*piVar30 + bVar38;
      pcVar1 = (char *)((long)&UINT_004e47b4 + lVar40 + 2);
      *pcVar1 = *pcVar1 + bVar38;
      cpi_00 = (AV1_COMP *)(ulong)(uVar39 + uVar55);
      piVar33 = (int *)CONCAT71(uVar35,(bVar38 + 0x46) - CARRY4(uVar39,uVar55));
      uVar59 = (int)piVar33 + *piVar33;
      piVar30 = (int *)(ulong)uVar59;
      *(char *)piVar30 = (char)*piVar30 + (char)uVar59;
      pTVar62 = (ThreadData_conflict *)0x0;
LAB_001f0114:
      pAVar44 = (AV1_COMP *)0xff;
      if ((char)pTVar62 == '\0') {
        pAVar44 = (AV1_COMP *)(ulong)subsize_lookup[3][(long)__n];
      }
      if ((byte)td < 10) {
        __n = (uint *)(ulong)*(byte *)(piVar30 + 0x139240);
        uVar59 = (uint)(*(byte *)(piVar30 + 0x139240) >> 1);
        uVar67 = (uint)part_split_rd;
        switch((ulong)td & 0xff) {
        case 3:
          if ((char)uVar71 != '\x03') goto LAB_001f01b9;
        default:
          dst_ctx = (BLOCK_SIZE (*) [6])
                    ((long)(int)uVar55 +
                    *(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] + 4));
          cpi_00 = (AV1_COMP *)
                   ((long)(cpi_00->enc_quant_dequant_params).quants.y_zbin[-7] +
                   (ulong)(uVar67 & 0x1f));
          __n_00 = (anon_struct_2_2_d7866a68 *)(ulong)*(byte *)(piVar30 + 0x139248);
          __s = (AV1_COMP *)0x0;
          paVar74 = partition_context_lookup;
code_r0x001f018a:
          bVar38 = *(byte *)((long)((PC_TREE *)paVar74)->horizontal + (long)__s * 2 + -0x10);
          *(undefined8 *)((long)paVar52 + -8) = 0x1f0194;
          memset(dst_ctx,(uint)bVar38,(size_t)__n);
          uVar39 = (uint)*(byte *)((long)((PC_TREE *)paVar74)->horizontal + (long)__s * 2 + -0xf);
          __s = cpi_00;
          break;
        case 4:
          pvVar34 = (void *)((long)(cpi_00->enc_quant_dequant_params).quants.y_zbin[-7] +
                            (ulong)(uVar67 & 0x1f));
          __n_00 = (anon_struct_2_2_d7866a68 *)0x1;
          memset((void *)(*(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] +
                                   4) + (long)(int)uVar55),
                 (uint)(byte)partition_context_lookup[(long)pAVar44].above,1);
          memset(pvVar34,(uint)(byte)partition_context_lookup[(long)pAVar44].left,1);
          memset((void *)((long)(int)uVar55 +
                         *(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] + 4
                                  )),0x1f,1);
          uVar39 = 0x1f;
          __s = (AV1_COMP *)
                ((long)(cpi_00->enc_quant_dequant_params).quants.y_zbin[-7] +
                (ulong)(uVar59 + uVar67 & 0x1f));
          break;
        case 5:
          pvVar34 = (void *)((long)(cpi_00->enc_quant_dequant_params).quants.y_zbin[-7] +
                            (ulong)(uVar67 & 0x1f));
          uStack_560 = 1;
          __n_00 = (anon_struct_2_2_d7866a68 *)0x1;
          memset((void *)(*(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] +
                                   4) + (long)(int)uVar55),0x1f,1);
          memset(pvVar34,0x1f,1);
          __s = (AV1_COMP *)
                ((long)(int)uVar55 +
                *(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] + 4));
          cpi_00 = (AV1_COMP *)
                   ((long)(cpi_00->enc_quant_dequant_params).quants.y_zbin[-7] +
                   (ulong)(uVar59 + uVar67 & 0x1f));
          part_split_rd = partition_context_lookup;
code_r0x001f02e6:
          memset(__s,(uint)(byte)part_split_rd[(long)pAVar44].above,uStack_560);
          uVar39 = (uint)(byte)part_split_rd[(long)pAVar44].left;
          __s = cpi_00;
          break;
        case 6:
          __s = (AV1_COMP *)
                ((long)(cpi_00->enc_quant_dequant_params).quants.y_zbin[-7] + (ulong)(uVar67 & 0x1f)
                );
          __n_00 = (anon_struct_2_2_d7866a68 *)0x1;
          memset((void *)((long)(int)uVar55 +
                         *(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] + 4
                                  )),(uint)(byte)partition_context_lookup[(long)pAVar44].above,1);
          memset(__s,(uint)(byte)partition_context_lookup[(long)pAVar44].left,1);
          memset((void *)((long)(int)(uVar59 + uVar55) +
                         *(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] + 4
                                  )),0x1f,1);
          uVar39 = 0x1f;
          break;
        case 7:
          __s = (AV1_COMP *)
                ((long)(cpi_00->enc_quant_dequant_params).quants.y_zbin[-7] + (ulong)(uVar67 & 0x1f)
                );
          uStack_560 = 1;
          memset((void *)((long)(int)uVar55 +
                         *(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] + 4
                                  )),0x1f,1);
          memset(__s,0x1f,1);
          dst_ctx = (BLOCK_SIZE (*) [6])(long)(int)(uVar59 + uVar55);
          part_split_rd = (anon_struct_2_2_d7866a68 *)0x1;
switchD_001eda98_caseD_3a:
          __n_00 = part_split_rd;
          memset((void *)((long)&((aom_internal_error_info *)
                                 ((((AV1_COMP *)dst_ctx)->enc_quant_dequant_params).quants.y_quant +
                                 -1))->error_code +
                         *(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xf8] + 4
                                  )),(uint)(byte)partition_context_lookup[(long)pAVar44].above,
                 uStack_560);
          uVar39 = (uint)(byte)partition_context_lookup[(long)pAVar44].left;
        }
        pvVar34 = memset(__s,uVar39,(size_t)__n_00);
        return SUB81(pvVar34,0);
      }
LAB_001f01b9:
      return SUB81(piVar30,0);
    }
    *(char *)piVar30 = (char)*piVar30 + (char)piVar30;
    *(char *)((long)piVar30 + -0x48bf01) =
         *(char *)((long)piVar30 + -0x48bf01) + (char)((ulong)__n >> 8);
    puVar41 = (uint *)(uVar71 & 0xffffffff);
code_r0x001ee91b:
    local_500 = (ulong)__n & 0xff;
    if ((char)__n != -1) {
      uVar59 = (uint)uVar71;
      if (uVar59 < 10) {
        uVar24 = (*(code *)((long)&switchD_001ee940::switchdataD_004e4860 +
                           (long)(int)(&switchD_001ee940::switchdataD_004e4860)[(long)puVar41]))();
        return (_Bool)uVar24;
      }
      if (uVar59 == 0xc) {
        __n = (uint *)0x4;
LAB_001ee980:
        bVar75 = false;
      }
      else {
        if (uVar59 == 0xf) {
          __n = (uint *)0x5;
          goto LAB_001ee980;
        }
        __n = (uint *)0x6;
        bVar75 = true;
      }
      piVar33 = (int *)&stack0xfffffffffffffa98;
      if (!bVar75) {
        pTVar62 = (ThreadData_conflict *)(local_500 * 3);
code_r0x001ee98b:
        puVar51 = &stack0xfffffffffffffa90;
        dst_ctx = subsize_lookup;
code_r0x001ee997:
        dst_ctx = (BLOCK_SIZE (*) [6])
                  (ulong)*(byte *)((long)__n +
                                  (long)&((aom_internal_error_info *)
                                         ((((AV1_COMP *)dst_ctx)->enc_quant_dequant_params).quants.
                                          y_quant + -1))->error_code + (long)pTVar62 * 2);
        piVar33 = (int *)puVar51;
      }
    }
LAB_001ee99f:
    BVar23 = (BLOCK_SIZE)piVar30;
    (part_state->sum_rdc).rate = 0;
    (part_state->sum_rdc).zero_rate = 0;
    (part_state->sum_rdc).dist = 0;
    (part_state->sum_rdc).rdcost = 0;
    (part_state->sum_rdc).sse = 0;
    (part_state->sum_rdc).skip_txfm = '\x01';
    *(ThreadData_conflict **)(piVar33 + 0x24) = td;
    *(ulong *)(piVar33 + 0x22) = uVar71;
    *(ThreadData_conflict **)(piVar33 + 0x2c) = pTVar68;
    if (*(char *)((long)piVar33 + 0x5e) != -1) {
      uVar59 = (uint)uVar71;
      if (uVar59 < 10) {
        uVar24 = (*(code *)((long)&switchD_001ee9f5::switchdataD_004e4888 +
                           (long)(int)(&switchD_001ee9f5::switchdataD_004e4888)[(long)puVar41]))();
        return (_Bool)uVar24;
      }
      if (uVar59 == 0xc) {
        lVar40 = 4;
switchD_001ee9f5_caseD_0:
        bVar75 = false;
      }
      else {
        if (uVar59 == 0xf) {
          lVar40 = 5;
          goto switchD_001ee9f5_caseD_0;
        }
        lVar40 = 6;
        bVar75 = true;
      }
      if (!bVar75) {
        BVar23 = subsize_lookup[*(long *)(piVar33 + 0x1a)][lVar40];
      }
    }
    *(char *)((long)piVar33 + 0x5f) = (char)dst_ctx;
    *(RD_STATS **)(piVar33 + 0x20) = &part_state->sum_rdc;
    iVar25 = part_state->partition_cost[*(long *)(piVar33 + 0x1a)];
    (part_state->sum_rdc).rate = iVar25;
    iVar27 = *(int *)(*(long *)(piVar33 + 0x1c) + 0x4218);
    *(PartitionSearchState **)(piVar33 + 0x26) = part_state;
    (part_state->sum_rdc).rdcost = (long)iVar27 * (long)iVar25 + 0x100 >> 9;
    lVar40 = *(long *)(piVar33 + 0x28);
    lVar47 = 0;
    do {
      piVar33[-2] = 0x1eeac9;
      piVar33[-1] = 0;
      pPVar28 = av1_alloc_pmc(pAVar44,BVar23,(PC_TREE_SHARED_BUFFERS *)(lVar40 + 0x25c60));
      *(PICK_MODE_CONTEXT **)
       ((long)((__s->enc_quant_dequant_params).quants.y_quant + -1) + lVar47 * 8) = pPVar28;
      if (pPVar28 == (PICK_MODE_CONTEXT *)0x0) {
        info = *(aom_internal_error_info **)(*(long *)(piVar33 + 0x1c) + 0x2b90);
        piVar33[-2] = 0x1eeaed;
        piVar33[-1] = 0;
        aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
      }
      lVar47 = lVar47 + 1;
    } while (lVar47 != 4);
    iVar25 = **(int **)(piVar33 + 0x2c);
    iVar27 = (*(int **)(piVar33 + 0x2c))[1];
    lVar40 = 0;
    iVar65 = piVar33[0x19];
    iVar26 = piVar33[0x18];
    do {
      piVar33[lVar40 * 2 + 0x34] = iVar65;
      piVar33[lVar40 * 2 + 0x35] = iVar26;
      lVar40 = lVar40 + 1;
      iVar26 = iVar26 + iVar27;
      iVar65 = iVar65 + iVar25;
    } while (lVar40 != 4);
    cVar43 = *(char *)((long)piVar33 + 0x5e);
    lVar40 = 0;
    bVar38 = *(byte *)((long)piVar33 + 0x5f);
    puVar49 = *(undefined8 **)(piVar33 + 0x1e);
    while( true ) {
      if ((lVar40 != 0) &&
         (piVar33[(ulong)(cVar43 != '\b') + 0x32] <=
          *(int *)((long)piVar33 + lVar40 + (ulong)(cVar43 != '\b') * 4 + 0xd0))) goto LAB_001eec3f;
      lVar47 = *(long *)((long)((__s->enc_quant_dequant_params).quants.y_quant + -1) + lVar40);
      *(undefined4 *)(lVar47 + 0x1d0) = 0;
      iVar25 = *(int *)((long)piVar33 + lVar40 + 0xd0);
      uVar4 = *(undefined4 *)((long)piVar33 + lVar40 + 0xd4);
      *(undefined8 *)(piVar33 + 0xc) = puVar49[4];
      uVar11 = *puVar49;
      uVar12 = puVar49[1];
      uVar13 = puVar49[3];
      *(undefined8 *)(piVar33 + 8) = puVar49[2];
      *(undefined8 *)(piVar33 + 10) = uVar13;
      *(undefined8 *)(piVar33 + 4) = uVar11;
      *(undefined8 *)(piVar33 + 6) = uVar12;
      *(long *)(piVar33 + 0x12) = lVar47;
      piVar33[0x10] = (int)*(undefined8 *)(piVar33 + 0x1a);
      *(undefined8 *)(piVar33 + 0xe) = *(undefined8 *)(piVar33 + 0x20);
      piVar33[2] = (uint)bVar38;
      *piVar33 = uVar4;
      piVar33[-2] = 0x1eebe8;
      piVar33[-1] = 0;
      iVar25 = rd_try_subblock(pAVar44,*(ThreadData_conflict **)(piVar33 + 0x28),
                               *(TileDataEnc **)(piVar33 + 0x2e),*(TokenExtra ***)(piVar33 + 0x30),
                               (uint)(lVar40 == 0x18),iVar25,*piVar33,*(BLOCK_SIZE *)(piVar33 + 2),
                               *(RD_STATS *)(piVar33 + 4),*(RD_STATS **)(piVar33 + 0xe),
                               (PARTITION_TYPE)piVar33[0x10],*(PICK_MODE_CONTEXT **)(piVar33 + 0x12)
                              );
      if (iVar25 == 0) break;
      lVar40 = lVar40 + 8;
      puVar49 = *(undefined8 **)(piVar33 + 0x1e);
      if (lVar40 == 0x20) {
LAB_001eec3f:
        uVar59 = **(uint **)(piVar33 + 0x20);
        lVar40 = *(long *)(piVar33 + 0x26);
        if ((((ulong)uVar59 == 0x7fffffff) ||
            (lVar47 = *(long *)(lVar40 + 0x88), lVar47 == 0x7fffffffffffffff)) ||
           (*(long *)(lVar40 + 0x90) == 0x7fffffffffffffff)) {
          *(undefined8 *)(lVar40 + 0x80) = 0x7fffffff;
          *(undefined8 *)(lVar40 + 0x88) = 0x7fffffffffffffff;
          *(undefined8 *)(lVar40 + 0x90) = 0x7fffffffffffffff;
          *(undefined8 *)(lVar40 + 0x98) = 0x7fffffffffffffff;
          *(undefined1 *)(lVar40 + 0xa0) = 0;
          ctx = *(RD_SEARCH_MACROBLOCK_CONTEXT **)(piVar33 + 0x24);
          BVar23 = (BLOCK_SIZE)*(undefined8 *)(piVar33 + 0x22);
        }
        else {
          ctx = *(RD_SEARCH_MACROBLOCK_CONTEXT **)(piVar33 + 0x24);
          BVar23 = (BLOCK_SIZE)*(undefined8 *)(piVar33 + 0x22);
          if ((int)uVar59 < 0) {
            lVar47 = lVar47 * 0x80 -
                     ((long)((ulong)-uVar59 * (long)*(int *)(*(long *)(piVar33 + 0x1c) + 0x4218) +
                            0x100) >> 9);
          }
          else {
            lVar47 = lVar47 * 0x80 +
                     ((long)((ulong)uVar59 * (long)*(int *)(*(long *)(piVar33 + 0x1c) + 0x4218) +
                            0x100) >> 9);
          }
          *(long *)(lVar40 + 0x90) = lVar47;
        }
        if (*(long *)(lVar40 + 0x90) < (long)puVar49[2]) {
          puVar8 = *(undefined8 **)(piVar33 + 0x20);
          puVar49[4] = puVar8[4];
          uVar11 = *puVar8;
          uVar12 = puVar8[1];
          uVar13 = puVar8[3];
          puVar49[2] = puVar8[2];
          puVar49[3] = uVar13;
          *puVar49 = uVar11;
          puVar49[1] = uVar12;
          *(undefined1 *)(lVar40 + 0x144) = 1;
          **(undefined1 **)(piVar33 + 0x2a) = *(undefined1 *)((long)piVar33 + 0x5e);
        }
        bVar75 = ((pAVar44->common).seq_params)->monochrome == '\0';
        av1_restore_context(*(MACROBLOCK **)(piVar33 + 0x1c),ctx,piVar33[0x19],piVar33[0x18],BVar23,
                            bVar75 + 1 + (uint)bVar75);
        return (_Bool)extraout_AL;
      }
    }
    lVar40 = *(long *)(piVar33 + 0x26);
    *(undefined8 *)(lVar40 + 0x80) = 0x7fffffff;
    *(undefined8 *)(lVar40 + 0x88) = 0x7fffffffffffffff;
    *(undefined8 *)(lVar40 + 0x90) = 0x7fffffffffffffff;
    *(undefined8 *)(lVar40 + 0x98) = 0x7fffffffffffffff;
    *(undefined1 *)(lVar40 + 0xa0) = 0;
    puVar49 = *(undefined8 **)(piVar33 + 0x1e);
    goto LAB_001eec3f;
  }
LAB_001edfad:
  pAVar44 = (AV1_COMP *)&best_rdc;
  part_split_rd = (anon_struct_2_2_d7866a68 *)0x7fffffffffffffff;
  part4_search_allowed[0] = 1;
  part4_search_allowed[1] = 1;
  cpi_00 = cpi;
  paVar74 = (anon_struct_2_2_d7866a68 *)pPVar32;
  __s = pAVar73;
  if (best_rdc.rdcost != 0x7fffffffffffffff) {
    BVar23 = (cpi->sf).part_sf.ext_partition_eval_thresh;
    if ((((cpi->sf).part_sf.ext_part_eval_based_on_cur_best != 0) &&
        ((td->mb).must_find_valid_partition == 0)) && (pPVar32->partitioning == '\0')) {
      BVar23 = BLOCK_128X128;
    }
    pTVar62 = (ThreadData_conflict *)(ulong)part_search_state.part_blk_params.bsize;
    bVar38 = 1;
    if ((part_search_state.do_rectangular_split != 0) &&
       (BVar23 < part_search_state.part_blk_params.bsize)) {
      bVar38 = local_540 |
               (part_search_state.part_blk_params.has_cols == 0 ||
               part_search_state.part_blk_params.has_rows == 0);
    }
    if (part_search_state.part_blk_params.width <
        part_search_state.part_blk_params.min_partition_size_1d <<
        ((byte)(cpi->sf).part_sf.prune_part4_search & 0x1f)) {
      part4_search_allowed[0] = 0;
      part4_search_allowed[1] = 0;
    }
    else {
      __n = (uint *)(ulong)(byte)(bVar38 | (cpi->oxcf).part_cfg.enable_1to4_partitions ^ 1U |
                                 part_search_state.part_blk_params.bsize == BLOCK_128X128);
      puVar41 = (uint *)(long)part_search_state.ss_x;
      dst_ctx = (BLOCK_SIZE (*) [6])(long)part_search_state.ss_y;
      uVar71 = 0;
      piVar30 = (int *)best_rdc.rdcost;
      do {
        uVar59 = 0;
        if (((char)__n != '\0') || (part_search_state.partition_rect_allowed[uVar71] == 0))
        goto LAB_001ee140;
        uVar59 = (uint)pTVar62;
        if (9 < uVar59) {
          if (uVar59 == 0xc) {
            pTVar68 = (ThreadData_conflict *)&DAT_00000004;
          }
          else {
            if (uVar59 != 0xf) goto switchD_001ee0ad_caseD_1ee0ca;
code_r0x001ee0c2:
            pTVar68 = (ThreadData_conflict *)0x5;
          }
          goto LAB_001ee0f3;
        }
code_r0x001ee09c:
        switch((long)&switchD_001ee0ad::switchdataD_004e4810 +
               (long)(int)(&switchD_001ee0ad::switchdataD_004e4810)[(ulong)pTVar62 & 0xffffffff]) {
        case 0x1ee0b0:
          bVar75 = false;
          pTVar68 = pTVar62;
          td = pTVar80;
          goto LAB_001ee0f6;
        case 0x1ee0ca:
switchD_001ee0ad_caseD_1ee0ca:
          bVar75 = true;
          pTVar68 = (ThreadData_conflict *)0x6;
          td = pTVar80;
          goto LAB_001ee0f6;
        case 0x1ee0d5:
switchD_001eda98_caseD_a:
          pTVar68 = (ThreadData_conflict *)0x3;
          break;
        case 0x1ee0dd:
          pTVar68 = (ThreadData_conflict *)0x1;
          break;
        case 0x1ee0e5:
          pTVar68 = (ThreadData_conflict *)0x2;
        }
LAB_001ee0f3:
        bVar75 = false;
        td = pTVar80;
LAB_001ee0f6:
        uVar60 = 0xff;
        if (!bVar75) {
          uVar60 = (ulong)subsize_lookup[(byte)(&DAT_004e4d56)[uVar71]][(long)(pTVar68->mb).plane];
        }
        pTVar68 = (ThreadData_conflict *)(av1_ss_size_lookup + uVar60);
        uVar59 = (uint)(*(BLOCK_SIZE *)
                         ((long)&((aom_internal_error_info *)
                                 ((((AV1_COMP *)dst_ctx)->enc_quant_dequant_params).quants.y_quant +
                                 -1))->error_code + (long)puVar41 * 2 +
                         (long)&(pTVar68->mb).plane[0].src_diff) != BLOCK_INVALID);
        pTVar80 = td;
LAB_001ee140:
        part4_search_allowed[uVar71] = uVar59;
        uVar71 = uVar71 + 1;
      } while (uVar71 == 1);
      if ((cpi_00->sf).part_sf.prune_ext_partition_types_search_level == 2) {
        bVar38 = ((PC_TREE *)paVar74)->partitioning;
        uVar59 = bVar38 - 1;
        if ((4 < (byte)uVar59) || (uVar39 = 1, (0x1dU >> (uVar59 & 0x1f) & 1) == 0)) {
          uVar39 = (uint)(bVar38 == 0);
        }
        uVar59 = bVar38 - 2;
        if ((5 < (byte)uVar59) || (uVar55 = 1, (0x33U >> (uVar59 & 0x1f) & 1) == 0)) {
          uVar55 = (uint)(bVar38 == 0);
        }
        part4_search_allowed[1] = part4_search_allowed[1] & uVar55;
        part4_search_allowed[0] = part4_search_allowed[0] & uVar39;
      }
      if ((((char)__n == '\0' && (cpi_00->sf).part_sf.ml_prune_partition != 0) &&
          (part_search_state.partition_rect_allowed[0] != 0)) &&
         (part_search_state.partition_rect_allowed[1] != 0)) {
        av1_ml_prune_4_partition
                  (cpi_00,&td->mb,(uint)((PC_TREE *)paVar74)->partitioning,(int64_t)piVar30,
                   &part_search_state,part4_search_allowed,local_4d8);
        td = pTVar80;
        pTVar80 = td;
      }
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uStack_340;
      _var_max = auVar19 << 0x40;
      iVar25 = (td->mb).qindex;
      iVar27 = 3;
      if (0x55 < iVar25) {
        iVar27 = (0xff - iVar25) / 0x55 + 1;
      }
      iVar25 = (cpi_00->sf).part_sf.prune_ext_part_using_split_info;
      lVar40 = 0;
      do {
        if (((iVar25 != 0) && (bVar38 = (&DAT_004e4d58)[lVar40], part4_search_allowed[bVar38] != 0))
           && (iVar26 = (-(uint)(part_search_state.tmp_partition_cost[lVar40 + -0x17] == 0) -
                        (uint)(part_search_state.tmp_partition_cost[lVar40 + -0x1b] == 0)) +
                        (((*(int *)((long)&var_max + lVar40 * 4) -
                          (uint)(part_search_state.split_part_rect_win[0].rect_part_win[lVar40] == 0
                                )) + 4) -
                        (uint)(part_search_state.tmp_partition_cost[lVar40 + -0x19] == 0)),
              *(int *)((long)&var_max + lVar40 * 4) = iVar26, iVar26 < iVar27)) {
          part4_search_allowed[bVar38] = 0;
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 == 1);
    }
  }
  if ((part_search_state.terminate_partition_search == 0) && (part4_search_allowed[0] != 0)) {
    var_max = (double)CONCAT71(0,"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                 [local_298] >> 2);
    uVar24 = 8;
    uVar79 = 0;
    rd_pick_4partition(cpi_00,td,tile_data,tp,&td->mb,&x_ctx,(PC_TREE *)paVar74,local_1d8,
                       &part_search_state,(RD_STATS *)pAVar44,(int *)&var_max,'\b');
    td = pTVar80;
    pTVar80 = td;
  }
  if ((part4_search_allowed[1] != 0 && uVar67 != 0) &&
      part_search_state.terminate_partition_search == 0) {
    var_max = (double)((ulong)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [local_298] >> 2) << 0x20);
    uVar24 = 9;
    uVar79 = 0;
    rd_pick_4partition(cpi_00,td,tile_data,tp,&td->mb,&x_ctx,(PC_TREE *)paVar74,local_1e0,
                       &part_search_state,(RD_STATS *)pAVar44,(int *)&var_max,'\t');
    td = pTVar80;
    pTVar80 = td;
  }
  if ((((cpi_00->common).seq_params)->sb_size == (BLOCK_SIZE)__s) &&
     (part_search_state.found_best_partition == false)) goto code_r0x001ee42c;
  *(undefined8 *)&rd_cost->skip_txfm =
       *(undefined8 *)(pAVar44->enc_quant_dequant_params).quants.y_quant[1];
  pAVar9 = pAVar44->ppi;
  iVar61 = *(int64_t *)&pAVar44->field_0x8;
  iVar10 = *(int64_t *)((pAVar44->enc_quant_dequant_params).quants.y_quant[0] + 4);
  rd_cost->rdcost = *(int64_t *)(pAVar44->enc_quant_dequant_params).quants.y_quant[0];
  rd_cost->sse = iVar10;
  *(AV1_PRIMARY **)rd_cost = pAVar9;
  rd_cost->dist = iVar61;
  if (sms_tree != (SIMPLE_MOTION_DATA_TREE *)0x0) {
    sms_tree->partitioning = ((PC_TREE *)paVar74)->partitioning;
  }
  part_split_rd = (anon_struct_2_2_d7866a68 *)0x1;
  cVar43 = '\x01';
  puVar49 = (undefined8 *)&stack0xfffffffffffffa98;
  if (part_search_state.found_best_partition != true) goto LAB_001ee6de;
  BVar23 = ((cpi_00->common).seq_params)->sb_size;
  puVar41 = (uint *)(ulong)BVar23;
  if (BVar23 == (BLOCK_SIZE)__s) {
    (td->mb).cb_offset[0] = 0;
    (td->mb).cb_offset[1] = 0;
    encode_sb(cpi_00,td,tile_data,tp,mi_row,mi_col,multi_pass_mode == '\x01',bsize,
              (PC_TREE *)paVar74,(int *)CONCAT71(uVar79,uVar24));
    cVar43 = '\0';
    td = pTVar80;
    av1_free_pc_tree_recursive
              ((PC_TREE *)paVar74,iVar65,0,0,(cpi_00->sf).part_sf.partition_search_type);
    td->pc_root = (PC_TREE *)0x0;
    paVar74 = (anon_struct_2_2_d7866a68 *)0x0;
    puVar49 = (undefined8 *)&stack0xfffffffffffffa98;
    goto LAB_001ee6de;
  }
LAB_001ee622:
  cVar43 = (char)part_split_rd;
  BVar23 = (td->mb).sb_enc.max_partition_size;
  piVar30 = (int *)(ulong)BVar23;
  puVar49 = (undefined8 *)puVar48;
  if (BVar23 < (BLOCK_SIZE)__s) goto LAB_001ee6de;
code_r0x001ee632:
  cVar43 = (char)part_split_rd;
  puVar49 = (undefined8 *)puVar48;
  if (((PC_TREE *)paVar74)->index == 3) {
switchD_001eda98_caseD_17:
    cVar43 = (char)part_split_rd;
    BVar69 = (BLOCK_SIZE)__s;
    BVar23 = (BLOCK_SIZE)piVar30;
    uVar59 = (uint)puVar41;
    __n = puVar41;
    puVar50 = (undefined1 *)puVar49;
    if (9 < uVar59) {
      if (uVar59 == 0xc) {
        puVar41 = (uint *)0x4;
      }
      else {
        if (uVar59 != 0xf) goto switchD_001ee652_caseD_1ee66c;
        puVar41 = (uint *)0x5;
      }
      goto switchD_001ee652_caseD_1ee688;
    }
switchD_001eda98_caseD_14:
    cVar43 = (char)part_split_rd;
    BVar69 = (BLOCK_SIZE)__s;
    BVar23 = (BLOCK_SIZE)piVar30;
    puVar49 = (undefined8 *)puVar50;
    switch((long)&switchD_001ee652::switchdataD_004e4838 +
           (long)(int)(&switchD_001ee652::switchdataD_004e4838)[(long)__n]) {
    case 0x1ee654:
      puVar41 = (uint *)0x1;
      break;
    case 0x1ee66c:
switchD_001ee652_caseD_1ee66c:
      puVar41 = (uint *)0x6;
      bVar75 = true;
      goto LAB_001ee68a;
    case 0x1ee675:
      puVar41 = (uint *)0x3;
      break;
    case 0x1ee67c:
      puVar41 = (uint *)0x2;
    }
switchD_001ee652_caseD_1ee688:
    bVar75 = false;
    puVar49 = (undefined8 *)puVar50;
LAB_001ee68a:
    BVar57 = BLOCK_INVALID;
    if (!bVar75) {
      BVar57 = subsize_lookup[3][(long)puVar41];
    }
    if ((BVar23 != BVar69) || (BVar57 == BVar23)) goto LAB_001ee6de;
  }
  puVar49[-2] = paVar74;
  puVar49[-3] = puVar49[4];
  puVar49[-4] = 1;
  puVar49[-5] = 0x1ee6d5;
  encode_sb(cpi_00,td,(TileDataEnc *)puVar49[6],(TokenExtra **)puVar49[0x10],(int)puVar49[0xd],
            (int)puVar49[0xe],*(RUN_TYPE *)(puVar49 + -4),*(BLOCK_SIZE *)(puVar49 + -3),
            (PC_TREE *)puVar49[-2],(int *)puVar49[-1]);
  td = (ThreadData_conflict *)*puVar49;
LAB_001ee6de:
  if (cVar43 != '\0') {
    partition_search_type = (cpi_00->sf).part_sf.partition_search_type;
    puVar49[-1] = 0x1ee701;
    av1_free_pc_tree_recursive
              ((PC_TREE *)paVar74,*(int *)((long)puVar49 + 0x4c),1,1,partition_search_type);
    td = (ThreadData_conflict *)*puVar49;
  }
  (td->mb).rdmult = *(int *)((long)puVar49 + 0x2c4);
  return (_Bool)*(undefined1 *)((long)puVar49 + 0x1ec);
LAB_001ef9f6:
  if ((bVar38 == (&comp_ref0_lut)[lVar40]) && (cVar43 == (&comp_ref1_lut)[lVar40])) {
    cVar58 = (char)lVar40;
    goto LAB_001efbfa;
  }
  lVar40 = lVar40 + 1;
  if (lVar40 == 9) {
LAB_001efbfa:
    if (cVar58 < '\0') {
      bVar38 = (cVar43 * '\x04' + bVar38) - 0xd;
    }
    else {
      bVar38 = cVar58 + 0x14;
    }
LAB_001efc11:
    uVar71 = (ulong)bVar38;
    paiVar3 = (cpi_00->enc_quant_dequant_params).quants.y_round + (ulong)bVar38 * 2 + 0xc6;
    uVar11 = *(undefined8 *)*paiVar3;
    uVar12 = *(undefined8 *)(*paiVar3 + 4);
    paiVar3 = (cpi_00->enc_quant_dequant_params).quants.y_round + (ulong)bVar38 * 2 + 199;
    uVar13 = *(undefined8 *)(*paiVar3 + 4);
    puVar49[2] = *(undefined8 *)*paiVar3;
    puVar49[3] = uVar13;
    *puVar49 = uVar11;
    puVar49[1] = uVar12;
    puVar49[4] = *(undefined8 *)
                  ((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0] + uVar71 * 4);
    *(int16_t *)((long)puVar49 + 0x4c) =
         (cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x12][uVar71 + 4];
    *(undefined1 *)(puVar49 + 5) =
         *(undefined1 *)
          ((long)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0xe] + uVar71 + 8);
    uVar11 = *(undefined8 *)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x11];
    uVar12 = *(undefined8 *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x11] + 4);
    uVar13 = *(undefined8 *)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x12];
    *(undefined8 *)((long)puVar49 + 0x2c) =
         *(undefined8 *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x10] + 4);
    *(undefined8 *)((long)puVar49 + 0x34) = uVar11;
    *(undefined8 *)((long)puVar49 + 0x3c) = uVar12;
    *(undefined8 *)((long)puVar49 + 0x44) = uVar13;
    uStack_54c = (undefined4)((ulong)cpi >> 0x20);
    *(undefined4 *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) = uStack_54c;
    return SUB81((ulong)cpi >> 0x20,0);
  }
  goto LAB_001ef9f6;
code_r0x001ee42c:
  (td->mb).must_find_valid_partition = 1;
  pPVar32 = (PC_TREE *)paVar74;
  goto LAB_001ebd7f;
}

Assistant:

bool av1_rd_pick_partition(AV1_COMP *const cpi, ThreadData *td,
                           TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                           int mi_col, BLOCK_SIZE bsize, RD_STATS *rd_cost,
                           RD_STATS best_rdc, PC_TREE *pc_tree,
                           SIMPLE_MOTION_DATA_TREE *sms_tree, int64_t *none_rd,
                           SB_MULTI_PASS_MODE multi_pass_mode,
                           RD_RECT_PART_WIN_INFO *rect_part_win_info) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  const TokenExtra *const tp_orig = *tp;
  PartitionSearchState part_search_state;

  // Initialization of state variables used in partition search.
  init_partition_search_state_params(x, cpi, &part_search_state, mi_row, mi_col,
                                     bsize);
  PartitionBlkParams blk_params = part_search_state.part_blk_params;

  set_sms_tree_partitioning(sms_tree, PARTITION_NONE);
  if (best_rdc.rdcost < 0) {
    av1_invalid_rd_stats(rd_cost);
    return part_search_state.found_best_partition;
  }
  if (bsize == cm->seq_params->sb_size) x->must_find_valid_partition = 0;

  // Override skipping rectangular partition operations for edge blocks.
  if (none_rd) *none_rd = 0;
  (void)*tp_orig;

#if CONFIG_COLLECT_PARTITION_STATS
  // Stats at the current quad tree
  PartitionTimingStats *part_timing_stats =
      &part_search_state.part_timing_stats;
  // Stats aggregated at frame level
  FramePartitionTimingStats *fr_part_timing_stats = &cpi->partition_stats;
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Override partition costs at the edges of the frame in the same
  // way as in read_partition (see decodeframe.c).
  if (!av1_blk_has_rows_and_cols(&blk_params))
    set_partition_cost_for_edge_blk(cm, &part_search_state);

  // Disable rectangular partitions for inner blocks when the current block is
  // forced to only use square partitions.
  if (bsize > cpi->sf.part_sf.use_square_partition_only_threshold) {
    part_search_state.partition_rect_allowed[HORZ] &= !blk_params.has_rows;
    part_search_state.partition_rect_allowed[VERT] &= !blk_params.has_cols;
  }

#ifndef NDEBUG
  // Nothing should rely on the default value of this array (which is just
  // leftover from encoding the previous block. Setting it to fixed pattern
  // when debugging.
  // bit 0, 1, 2 are blk_skip of each plane
  // bit 4, 5, 6 are initialization checking of each plane
  memset(x->txfm_search_info.blk_skip, 0x77,
         sizeof(x->txfm_search_info.blk_skip));
#endif  // NDEBUG

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);

  // Set buffers and offsets.
  av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);

  if (cpi->oxcf.mode == ALLINTRA) {
    if (bsize == cm->seq_params->sb_size) {
      double var_min, var_max;
      log_sub_block_var(cpi, x, bsize, &var_min, &var_max);

      x->intra_sb_rdmult_modifier = 128;
      if ((var_min < 2.0) && (var_max > 4.0)) {
        if ((var_max - var_min) > 8.0) {
          x->intra_sb_rdmult_modifier -= 48;
        } else {
          x->intra_sb_rdmult_modifier -= (int)((var_max - var_min) * 6);
        }
      }
    }
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);

  // Apply simple motion search for the entire super block with fixed block
  // size, e.g., 16x16, to collect features and write to files for the
  // external ML model.
  // TODO(chengchen): reduce motion search. This function is similar to
  // av1_get_max_min_partition_features().
  if (COLLECT_MOTION_SEARCH_FEATURE_SB && !frame_is_intra_only(cm) &&
      bsize == cm->seq_params->sb_size) {
    av1_collect_motion_search_features_sb(cpi, td, tile_data, mi_row, mi_col,
                                          bsize, /*features=*/NULL);
    collect_tpl_stats_sb(cpi, bsize, mi_row, mi_col, /*features=*/NULL);
  }

  // Update rd cost of the bound using the current multiplier.
  av1_rd_cost_update(x->rdmult, &best_rdc);

  if (bsize == BLOCK_16X16 && cpi->vaq_refresh)
    x->mb_energy = av1_log_block_var(cpi, x, bsize);

  // Set the context.
  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_prune_partitions_time);
#endif
  // Pruning: before searching any partition type, using source and simple
  // motion search results to prune out unlikely partitions.
  av1_prune_partitions_before_search(cpi, x, sms_tree, &part_search_state);

  // Pruning: eliminating partition types leading to coding block sizes outside
  // the min and max bsize limitations set from the encoder.
  av1_prune_partitions_by_max_min_bsize(&x->sb_enc, &part_search_state);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_prune_partitions_time);
#endif

  // Partition search
BEGIN_PARTITION_SEARCH:
  // If a valid partition is required, usually when the first round cannot find
  // a valid one under the cost limit after pruning, reset the limitations on
  // partition types and intra cnn output.
  if (x->must_find_valid_partition) {
    reset_part_limitations(cpi, &part_search_state);
    av1_prune_partitions_by_max_min_bsize(&x->sb_enc, &part_search_state);
    // Invalidate intra cnn output for key frames.
    if (frame_is_intra_only(cm) && bsize == BLOCK_64X64) {
      part_search_state.intra_part_info->quad_tree_idx = 0;
      part_search_state.intra_part_info->cnn_output_valid = 0;
    }
  }
  // Partition block source pixel variance.
  unsigned int pb_source_variance = UINT_MAX;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, none_partition_search_time);
#endif

  if (cpi->oxcf.mode == ALLINTRA) {
    const bool bsize_at_least_16x16 = (bsize >= BLOCK_16X16);
    const bool prune_rect_part_using_4x4_var_deviation =
        (cpi->sf.part_sf.prune_rect_part_using_4x4_var_deviation &&
         !x->must_find_valid_partition);

    if (bsize_at_least_16x16 || prune_rect_part_using_4x4_var_deviation) {
      double var_min, var_max;
      log_sub_block_var(cpi, x, bsize, &var_min, &var_max);

      // Further pruning or in some cases reverse pruning when allintra is set.
      // This code helps visual and in some cases metrics quality where the
      // current block comprises at least one very low variance sub-block and at
      // least one where the variance is much higher.
      //
      // The idea is that in such cases there is danger of ringing and other
      // visual artifacts from a high variance feature such as an edge into a
      // very low variance region.
      //
      // The approach taken is to force break down / split to a smaller block
      // size to try and separate out the low variance and well predicted blocks
      // from the more complex ones and to prevent propagation of ringing over a
      // large region.
      if (bsize_at_least_16x16 && (var_min < 0.272) &&
          ((var_max - var_min) > 3.0)) {
        part_search_state.partition_none_allowed = 0;
        part_search_state.terminate_partition_search = 0;
        part_search_state.do_square_split = 1;
      } else if (prune_rect_part_using_4x4_var_deviation &&
                 (var_max - var_min < 3.0)) {
        // Prune rectangular partitions if the variance deviation of 4x4
        // sub-blocks within the block is less than a threshold (derived
        // empirically).
        part_search_state.do_rectangular_split = 0;
      }
    }
  }

  // PARTITION_NONE search stage.
  int64_t part_none_rd = INT64_MAX;
  none_partition_search(cpi, td, tile_data, x, pc_tree, sms_tree, &x_ctx,
                        &part_search_state, &best_rdc, &pb_source_variance,
                        none_rd, &part_none_rd);

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, none_partition_search_time);
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, split_partition_search_time);
#endif
  // PARTITION_SPLIT search stage.
  int64_t part_split_rd = INT64_MAX;
  split_partition_search(cpi, td, tile_data, tp, x, pc_tree, sms_tree, &x_ctx,
                         &part_search_state, &best_rdc, multi_pass_mode,
                         &part_split_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, split_partition_search_time);
#endif
  // Terminate partition search for child partition,
  // when NONE and SPLIT partition rd_costs are INT64_MAX.
  if (cpi->sf.part_sf.early_term_after_none_split &&
      part_none_rd == INT64_MAX && part_split_rd == INT64_MAX &&
      !x->must_find_valid_partition && (bsize != cm->seq_params->sb_size)) {
    part_search_state.terminate_partition_search = 1;
  }

  // Do not evaluate non-square partitions if NONE partition did not choose a
  // newmv mode and is skippable.
  if ((cpi->sf.part_sf.skip_non_sq_part_based_on_none >= 2) &&
      (pc_tree->none != NULL)) {
    if (x->qindex <= 200 && is_inter_mode(pc_tree->none->mic.mode) &&
        !have_newmv_in_inter_mode(pc_tree->none->mic.mode) &&
        pc_tree->none->skippable && !x->must_find_valid_partition &&
        bsize >= BLOCK_16X16)
      part_search_state.do_rectangular_split = 0;
  }

  // Prune partitions based on PARTITION_NONE and PARTITION_SPLIT.
  prune_partitions_after_split(cpi, x, sms_tree, &part_search_state, &best_rdc,
                               part_none_rd, part_split_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rectangular_partition_search_time);
#endif
  // Rectangular partitions search stage.
  rectangular_partition_search(cpi, td, tile_data, tp, x, pc_tree, &x_ctx,
                               &part_search_state, &best_rdc,
                               rect_part_win_info, HORZ, VERT);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rectangular_partition_search_time);
#endif

  if (pb_source_variance == UINT_MAX) {
    av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);
    pb_source_variance = av1_get_perpixel_variance_facade(
        cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  }

  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part_search_state.do_rectangular_split));

  const int prune_ext_part_state = prune_ext_part_none_skippable(
      pc_tree->none, x->must_find_valid_partition,
      cpi->sf.part_sf.skip_non_sq_part_based_on_none, bsize);

  const int ab_partition_allowed = allow_ab_partition_search(
      &part_search_state, &cpi->sf.part_sf, pc_tree->partitioning,
      x->must_find_valid_partition, prune_ext_part_state, best_rdc.rdcost);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, ab_partitions_search_time);
#endif
  // AB partitions search stage.
  ab_partitions_search(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       &part_search_state, &best_rdc, rect_part_win_info,
                       pb_source_variance, ab_partition_allowed, HORZ_A,
                       VERT_B);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, ab_partitions_search_time);
#endif

  // 4-way partitions search stage.
  int part4_search_allowed[NUM_PART4_TYPES] = { 1, 1 };
  // Prune 4-way partition search.
  prune_4_way_partition_search(cpi, x, pc_tree, &part_search_state, &best_rdc,
                               pb_source_variance, prune_ext_part_state,
                               part4_search_allowed);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rd_pick_4partition_time);
#endif
  // PARTITION_HORZ_4
  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part4_search_allowed[HORZ4]));
  if (!part_search_state.terminate_partition_search &&
      part4_search_allowed[HORZ4]) {
    const int inc_step[NUM_PART4_TYPES] = { mi_size_high[blk_params.bsize] / 4,
                                            0 };
    // Evaluation of Horz4 partition type.
    rd_pick_4partition(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       pc_tree->horizontal4, &part_search_state, &best_rdc,
                       inc_step, PARTITION_HORZ_4);
  }

  // PARTITION_VERT_4
  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part4_search_allowed[VERT4]));
  if (!part_search_state.terminate_partition_search &&
      part4_search_allowed[VERT4] && blk_params.has_cols) {
    const int inc_step[NUM_PART4_TYPES] = { 0, mi_size_wide[blk_params.bsize] /
                                                   4 };
    // Evaluation of Vert4 partition type.
    rd_pick_4partition(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       pc_tree->vertical4, &part_search_state, &best_rdc,
                       inc_step, PARTITION_VERT_4);
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rd_pick_4partition_time);
#endif

  if (bsize == cm->seq_params->sb_size &&
      !part_search_state.found_best_partition) {
    // Did not find a valid partition, go back and search again, with less
    // constraint on which partition types to search.
    x->must_find_valid_partition = 1;
#if CONFIG_COLLECT_PARTITION_STATS
    fr_part_timing_stats->partition_redo += 1;
#endif  // CONFIG_COLLECT_PARTITION_STATS
    goto BEGIN_PARTITION_SEARCH;
  }

  // Store the final rd cost
  *rd_cost = best_rdc;

  // Also record the best partition in simple motion data tree because it is
  // necessary for the related speed features.
  set_sms_tree_partitioning(sms_tree, pc_tree->partitioning);

#if CONFIG_COLLECT_PARTITION_STATS
  if (best_rdc.rate < INT_MAX && best_rdc.dist < INT64_MAX) {
    part_timing_stats->partition_decisions[pc_tree->partitioning] += 1;
  }

  // If CONFIG_COLLECT_PARTITION_STATS is 1, then print out the stats for each
  // prediction block.
  print_partition_timing_stats_with_rdcost(
      part_timing_stats, mi_row, mi_col, bsize,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index],
      cm->current_frame.frame_number, &best_rdc, "part_timing.csv");
  const bool print_timing_stats = false;
  if (print_timing_stats) {
    print_partition_timing_stats(part_timing_stats, cm->show_frame,
                                 frame_is_intra_only(cm), bsize,
                                 "part_timing_data.csv");
  }
  // If CONFIG_COLLECTION_PARTITION_STATS is 2, then we print out the stats for
  // the whole clip. So we need to pass the information upstream to the encoder.
  accumulate_partition_timing_stats(fr_part_timing_stats, part_timing_stats,
                                    bsize);
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Reset the PC_TREE deallocation flag.
  int pc_tree_dealloc = 0;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_time);
#endif
  if (part_search_state.found_best_partition) {
    if (bsize == cm->seq_params->sb_size) {
      // Encode the superblock.
      const int emit_output = multi_pass_mode != SB_DRY_PASS;
      const RUN_TYPE run_type = emit_output ? OUTPUT_ENABLED : DRY_RUN_NORMAL;

      // Write partition tree to file. Not used by default.
      if (COLLECT_MOTION_SEARCH_FEATURE_SB) {
        write_partition_tree(cpi, pc_tree, bsize, mi_row, mi_col);
        ++cpi->sb_counter;
      }

      set_cb_offsets(x->cb_offset, 0, 0);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, run_type, bsize,
                pc_tree, NULL);
      assert(pc_tree == td->pc_root);
      // Dealloc the whole PC_TREE after a superblock is done.
      av1_free_pc_tree_recursive(pc_tree, num_planes, 0, 0,
                                 cpi->sf.part_sf.partition_search_type);
      pc_tree = NULL;
      td->pc_root = NULL;
      pc_tree_dealloc = 1;
    } else if (should_do_dry_run_encode_for_current_block(
                   cm->seq_params->sb_size, x->sb_enc.max_partition_size,
                   pc_tree->index, bsize)) {
      // Encode the smaller blocks in DRY_RUN mode.
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_NORMAL, bsize,
                pc_tree, NULL);
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_time);
#endif

  // If the tree still exists (non-superblock), dealloc most nodes, only keep
  // nodes for the best partition and PARTITION_NONE.
  if (pc_tree_dealloc == 0)
    av1_free_pc_tree_recursive(pc_tree, num_planes, 1, 1,
                               cpi->sf.part_sf.partition_search_type);

  if (bsize == cm->seq_params->sb_size) {
    assert(best_rdc.rate < INT_MAX);
    assert(best_rdc.dist < INT64_MAX);
  } else {
    assert(tp_orig == *tp);
  }

  // Restore the rd multiplier.
  x->rdmult = orig_rdmult;
  return part_search_state.found_best_partition;
}